

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  float *pfVar7;
  uint uVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  Primitive PVar11;
  uint uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [12];
  float fVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [28];
  undefined1 auVar88 [28];
  undefined1 auVar89 [24];
  int iVar90;
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  long lVar94;
  ulong uVar95;
  undefined4 uVar96;
  undefined8 unaff_R13;
  ulong uVar97;
  long lVar98;
  undefined8 uVar99;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar120;
  float fVar122;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 bi_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar129 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  float fVar147;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  vint4 ai_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  float fVar197;
  undefined1 auVar194 [32];
  float fVar198;
  float fVar206;
  float fVar207;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar208;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar210;
  float fVar212;
  float fVar214;
  undefined1 auVar204 [32];
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar205 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined4 uVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  float fVar229;
  undefined1 auVar230 [32];
  float fVar232;
  undefined1 auVar231 [64];
  float fVar233;
  float fVar239;
  float fVar240;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  float fVar241;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar242 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  RTCFilterFunctionNArguments local_830;
  RayHitK<8> *local_800;
  RayQueryContext *local_7f8;
  size_t local_7f0;
  undefined1 (*local_7e8) [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  LinearSpace3fa *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [16];
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  int local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar97 = (ulong)(byte)PVar11;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + uVar97 * 0x19 + 6));
  fVar148 = *(float *)(prim + uVar97 * 0x19 + 0x12);
  auVar100._0_4_ = fVar148 * auVar15._0_4_;
  auVar100._4_4_ = fVar148 * auVar15._4_4_;
  auVar100._8_4_ = fVar148 * auVar15._8_4_;
  auVar100._12_4_ = fVar148 * auVar15._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar179._0_4_ = fVar148 * auVar16._0_4_;
  auVar179._4_4_ = fVar148 * auVar16._4_4_;
  auVar179._8_4_ = fVar148 * auVar16._8_4_;
  auVar179._12_4_ = fVar148 * auVar16._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xc + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xd + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x12 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x13 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x14 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar234._4_4_ = auVar179._0_4_;
  auVar234._0_4_ = auVar179._0_4_;
  auVar234._8_4_ = auVar179._0_4_;
  auVar234._12_4_ = auVar179._0_4_;
  auVar149 = vshufps_avx(auVar179,auVar179,0x55);
  auVar101 = vshufps_avx(auVar179,auVar179,0xaa);
  fVar148 = auVar101._0_4_;
  auVar215._0_4_ = fVar148 * auVar105._0_4_;
  fVar147 = auVar101._4_4_;
  auVar215._4_4_ = fVar147 * auVar105._4_4_;
  fVar120 = auVar101._8_4_;
  auVar215._8_4_ = fVar120 * auVar105._8_4_;
  fVar121 = auVar101._12_4_;
  auVar215._12_4_ = fVar121 * auVar105._12_4_;
  auVar199._0_4_ = auVar19._0_4_ * fVar148;
  auVar199._4_4_ = auVar19._4_4_ * fVar147;
  auVar199._8_4_ = auVar19._8_4_ * fVar120;
  auVar199._12_4_ = auVar19._12_4_ * fVar121;
  auVar192._0_4_ = auVar127._0_4_ * fVar148;
  auVar192._4_4_ = auVar127._4_4_ * fVar147;
  auVar192._8_4_ = auVar127._8_4_ * fVar120;
  auVar192._12_4_ = auVar127._12_4_ * fVar121;
  auVar101 = vfmadd231ps_fma(auVar215,auVar149,auVar16);
  auVar128 = vfmadd231ps_fma(auVar199,auVar149,auVar18);
  auVar149 = vfmadd231ps_fma(auVar192,auVar102,auVar149);
  auVar159 = vfmadd231ps_fma(auVar101,auVar234,auVar15);
  auVar128 = vfmadd231ps_fma(auVar128,auVar234,auVar17);
  auVar167 = vfmadd231ps_fma(auVar149,auVar103,auVar234);
  auVar235._4_4_ = auVar100._0_4_;
  auVar235._0_4_ = auVar100._0_4_;
  auVar235._8_4_ = auVar100._0_4_;
  auVar235._12_4_ = auVar100._0_4_;
  auVar149 = vshufps_avx(auVar100,auVar100,0x55);
  auVar101 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar148 = auVar101._0_4_;
  auVar180._0_4_ = fVar148 * auVar105._0_4_;
  fVar147 = auVar101._4_4_;
  auVar180._4_4_ = fVar147 * auVar105._4_4_;
  fVar120 = auVar101._8_4_;
  auVar180._8_4_ = fVar120 * auVar105._8_4_;
  fVar121 = auVar101._12_4_;
  auVar180._12_4_ = fVar121 * auVar105._12_4_;
  auVar126._0_4_ = auVar19._0_4_ * fVar148;
  auVar126._4_4_ = auVar19._4_4_ * fVar147;
  auVar126._8_4_ = auVar19._8_4_ * fVar120;
  auVar126._12_4_ = auVar19._12_4_ * fVar121;
  auVar101._0_4_ = auVar127._0_4_ * fVar148;
  auVar101._4_4_ = auVar127._4_4_ * fVar147;
  auVar101._8_4_ = auVar127._8_4_ * fVar120;
  auVar101._12_4_ = auVar127._12_4_ * fVar121;
  auVar16 = vfmadd231ps_fma(auVar180,auVar149,auVar16);
  auVar105 = vfmadd231ps_fma(auVar126,auVar149,auVar18);
  auVar18 = vfmadd231ps_fma(auVar101,auVar149,auVar102);
  auVar102 = vfmadd231ps_fma(auVar16,auVar235,auVar15);
  auVar127 = vfmadd231ps_fma(auVar105,auVar235,auVar17);
  local_3d0._8_4_ = 0x7fffffff;
  local_3d0._0_8_ = 0x7fffffff7fffffff;
  local_3d0._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar159,local_3d0);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar188,1);
  auVar16 = vblendvps_avx(auVar159,auVar188,auVar15);
  auVar15 = vandps_avx(auVar128,local_3d0);
  auVar15 = vcmpps_avx(auVar15,auVar188,1);
  auVar105 = vblendvps_avx(auVar128,auVar188,auVar15);
  auVar15 = vandps_avx(auVar167,local_3d0);
  auVar15 = vcmpps_avx(auVar15,auVar188,1);
  auVar15 = vblendvps_avx(auVar167,auVar188,auVar15);
  auVar149 = vfmadd231ps_fma(auVar18,auVar235,auVar103);
  auVar17 = vrcpps_avx(auVar16);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = 0x3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar189);
  auVar17 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16 = vrcpps_avx(auVar105);
  auVar105 = vfnmadd213ps_fma(auVar105,auVar16,auVar189);
  auVar19 = vfmadd132ps_fma(auVar105,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar189);
  auVar103 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar102);
  auVar167._0_4_ = auVar17._0_4_ * auVar15._0_4_;
  auVar167._4_4_ = auVar17._4_4_ * auVar15._4_4_;
  auVar167._8_4_ = auVar17._8_4_ * auVar15._8_4_;
  auVar167._12_4_ = auVar17._12_4_ * auVar15._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar102);
  auVar174._0_4_ = auVar17._0_4_ * auVar15._0_4_;
  auVar174._4_4_ = auVar17._4_4_ * auVar15._4_4_;
  auVar174._8_4_ = auVar17._8_4_ * auVar15._8_4_;
  auVar174._12_4_ = auVar17._12_4_ * auVar15._12_4_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar97 * 0xe + 6);
  auVar15 = vpmovsxwd_avx(auVar105);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar127);
  auVar181._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar181._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar181._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar181._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar128._1_3_ = 0;
  auVar128[0] = PVar11;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vsubps_avx(auVar15,auVar127);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar97 * 0x15 + 6);
  auVar15 = vpmovsxwd_avx(auVar18);
  auVar127._0_4_ = auVar19._0_4_ * auVar16._0_4_;
  auVar127._4_4_ = auVar19._4_4_ * auVar16._4_4_;
  auVar127._8_4_ = auVar19._8_4_ * auVar16._8_4_;
  auVar127._12_4_ = auVar19._12_4_ * auVar16._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar149);
  auVar159._0_4_ = auVar103._0_4_ * auVar15._0_4_;
  auVar159._4_4_ = auVar103._4_4_ * auVar15._4_4_;
  auVar159._8_4_ = auVar103._8_4_ * auVar15._8_4_;
  auVar159._12_4_ = auVar103._12_4_ * auVar15._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar149);
  auVar102._0_4_ = auVar103._0_4_ * auVar15._0_4_;
  auVar102._4_4_ = auVar103._4_4_ * auVar15._4_4_;
  auVar102._8_4_ = auVar103._8_4_ * auVar15._8_4_;
  auVar102._12_4_ = auVar103._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar167,auVar174);
  auVar16 = vpminsd_avx(auVar181,auVar127);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar159,auVar102);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar200._4_4_ = uVar96;
  auVar200._0_4_ = uVar96;
  auVar200._8_4_ = uVar96;
  auVar200._12_4_ = uVar96;
  auVar16 = vmaxps_avx(auVar16,auVar200);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_3e0._0_4_ = auVar15._0_4_ * 0.99999964;
  local_3e0._4_4_ = auVar15._4_4_ * 0.99999964;
  local_3e0._8_4_ = auVar15._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar167,auVar174);
  auVar16 = vpmaxsd_avx(auVar181,auVar127);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar159,auVar102);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar149._4_4_ = uVar96;
  auVar149._0_4_ = uVar96;
  auVar149._8_4_ = uVar96;
  auVar149._12_4_ = uVar96;
  auVar16 = vminps_avx(auVar16,auVar149);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar103._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar128[4] = PVar11;
  auVar128._5_3_ = 0;
  auVar128[8] = PVar11;
  auVar128._9_3_ = 0;
  auVar128[0xc] = PVar11;
  auVar128._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar128,_DAT_01f4ad30);
  auVar15 = vcmpps_avx(local_3e0,auVar103,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar96 = vmovmskps_avx(auVar15);
  uVar97 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar96);
  local_668 = pre->ray_space + k;
  local_660 = mm_lookupmask_ps._16_8_;
  uStack_658 = mm_lookupmask_ps._24_8_;
  uStack_650 = mm_lookupmask_ps._16_8_;
  uStack_648 = mm_lookupmask_ps._24_8_;
  local_7e8 = (undefined1 (*) [32])&local_160;
  iVar90 = 1 << ((uint)k & 0x1f);
  auVar108._4_4_ = iVar90;
  auVar108._0_4_ = iVar90;
  auVar108._8_4_ = iVar90;
  auVar108._12_4_ = iVar90;
  auVar108._16_4_ = iVar90;
  auVar108._20_4_ = iVar90;
  auVar108._24_4_ = iVar90;
  auVar108._28_4_ = iVar90;
  auVar220 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar108 = vpand_avx2(auVar108,auVar220);
  local_280 = vpcmpeqd_avx2(auVar108,auVar220);
  do {
    if (uVar97 == 0) {
      return;
    }
    lVar94 = 0;
    for (uVar93 = uVar97; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
      lVar94 = lVar94 + 1;
    }
    uVar91 = *(uint *)(prim + 2);
    uVar12 = *(uint *)(prim + lVar94 * 4 + 6);
    pGVar13 = (context->scene->geometries).items[uVar91].ptr;
    uVar93 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                             pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar12);
    p_Var14 = pGVar13[1].intersectionFilterN;
    lVar94 = *(long *)&pGVar13[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar94 + (long)p_Var14 * uVar93);
    uVar75 = *(undefined8 *)*pauVar1;
    uVar76 = *(undefined8 *)(*pauVar1 + 8);
    auVar127 = *pauVar1;
    auVar19 = *pauVar1;
    auVar105 = *pauVar1;
    pauVar2 = (undefined1 (*) [16])(lVar94 + (uVar93 + 1) * (long)p_Var14);
    uVar77 = *(undefined8 *)*pauVar2;
    uVar78 = *(undefined8 *)(*pauVar2 + 8);
    auVar102 = *pauVar2;
    auVar18 = *pauVar2;
    auVar16 = *pauVar2;
    pauVar3 = (undefined1 (*) [16])(lVar94 + (uVar93 + 2) * (long)p_Var14);
    uVar79 = *(undefined8 *)*pauVar3;
    uVar80 = *(undefined8 *)(*pauVar3 + 8);
    auVar103 = *pauVar3;
    auVar17 = *pauVar3;
    auVar15 = *pauVar3;
    uVar97 = uVar97 - 1 & uVar97;
    pauVar4 = (undefined1 (*) [12])(lVar94 + (uVar93 + 3) * (long)p_Var14);
    uVar81 = *(undefined8 *)*pauVar4;
    uVar82 = *(undefined8 *)(*pauVar4 + 8);
    local_920 = (float)uVar81;
    fStack_91c = (float)((ulong)uVar81 >> 0x20);
    fStack_918 = (float)uVar82;
    fStack_914 = (float)((ulong)uVar82 >> 0x20);
    if (uVar97 != 0) {
      uVar95 = uVar97 - 1 & uVar97;
      for (uVar93 = uVar97; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
      }
      if (uVar95 != 0) {
        for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar90 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar149 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar159 = vinsertps_avx(auVar149,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar101 = vsubps_avx(*pauVar1,auVar159);
    uVar96 = auVar101._0_4_;
    auVar168._4_4_ = uVar96;
    auVar168._0_4_ = uVar96;
    auVar168._8_4_ = uVar96;
    auVar168._12_4_ = uVar96;
    auVar149 = vshufps_avx(auVar101,auVar101,0x55);
    auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
    aVar9 = (local_668->vx).field_0;
    aVar10 = (local_668->vy).field_0;
    fVar148 = (local_668->vz).field_0.m128[0];
    fVar147 = *(float *)((long)&(local_668->vz).field_0 + 4);
    fVar120 = *(float *)((long)&(local_668->vz).field_0 + 8);
    fVar121 = *(float *)((long)&(local_668->vz).field_0 + 0xc);
    auVar182._0_4_ = fVar148 * auVar101._0_4_;
    auVar182._4_4_ = fVar147 * auVar101._4_4_;
    auVar182._8_4_ = fVar120 * auVar101._8_4_;
    auVar182._12_4_ = fVar121 * auVar101._12_4_;
    auVar149 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar10,auVar149);
    auVar100 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar9,auVar168);
    auVar149 = vblendps_avx(auVar100,*pauVar1,8);
    auVar128 = vsubps_avx(*pauVar2,auVar159);
    uVar96 = auVar128._0_4_;
    auVar183._4_4_ = uVar96;
    auVar183._0_4_ = uVar96;
    auVar183._8_4_ = uVar96;
    auVar183._12_4_ = uVar96;
    auVar101 = vshufps_avx(auVar128,auVar128,0x55);
    auVar128 = vshufps_avx(auVar128,auVar128,0xaa);
    auVar216._0_4_ = fVar148 * auVar128._0_4_;
    auVar216._4_4_ = fVar147 * auVar128._4_4_;
    auVar216._8_4_ = fVar120 * auVar128._8_4_;
    auVar216._12_4_ = fVar121 * auVar128._12_4_;
    auVar101 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar10,auVar101);
    auVar126 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar9,auVar183);
    auVar101 = vblendps_avx(auVar126,*pauVar2,8);
    auVar167 = vsubps_avx(*pauVar3,auVar159);
    uVar96 = auVar167._0_4_;
    auVar190._4_4_ = uVar96;
    auVar190._0_4_ = uVar96;
    auVar190._8_4_ = uVar96;
    auVar190._12_4_ = uVar96;
    auVar128 = vshufps_avx(auVar167,auVar167,0x55);
    auVar167 = vshufps_avx(auVar167,auVar167,0xaa);
    auVar223._0_4_ = fVar148 * auVar167._0_4_;
    auVar223._4_4_ = fVar147 * auVar167._4_4_;
    auVar223._8_4_ = fVar120 * auVar167._8_4_;
    auVar223._12_4_ = fVar121 * auVar167._12_4_;
    auVar128 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar10,auVar128);
    auVar174 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar9,auVar190);
    auVar128 = vblendps_avx(auVar174,*pauVar3,8);
    auVar83._12_4_ = fStack_914;
    auVar83._0_12_ = *pauVar4;
    auVar167 = vsubps_avx(auVar83,auVar159);
    uVar96 = auVar167._0_4_;
    auVar191._4_4_ = uVar96;
    auVar191._0_4_ = uVar96;
    auVar191._8_4_ = uVar96;
    auVar191._12_4_ = uVar96;
    auVar159 = vshufps_avx(auVar167,auVar167,0x55);
    auVar167 = vshufps_avx(auVar167,auVar167,0xaa);
    auVar224._0_4_ = fVar148 * auVar167._0_4_;
    auVar224._4_4_ = fVar147 * auVar167._4_4_;
    auVar224._8_4_ = fVar120 * auVar167._8_4_;
    auVar224._12_4_ = fVar121 * auVar167._12_4_;
    auVar159 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar10,auVar159);
    auVar179 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar9,auVar191);
    auVar159 = vblendps_avx(auVar179,auVar83,8);
    auVar149 = vandps_avx(auVar149,local_3d0);
    auVar101 = vandps_avx(auVar101,local_3d0);
    auVar167 = vmaxps_avx(auVar149,auVar101);
    auVar149 = vandps_avx(auVar128,local_3d0);
    auVar101 = vandps_avx(auVar159,local_3d0);
    auVar149 = vmaxps_avx(auVar149,auVar101);
    auVar149 = vmaxps_avx(auVar167,auVar149);
    auVar101 = vmovshdup_avx(auVar149);
    auVar101 = vmaxss_avx(auVar101,auVar149);
    auVar149 = vshufpd_avx(auVar149,auVar149,1);
    auVar149 = vmaxss_avx(auVar149,auVar101);
    lVar94 = (long)iVar90 * 0x44;
    auVar101 = vmovshdup_avx(auVar100);
    uVar99 = auVar101._0_8_;
    local_580._8_8_ = uVar99;
    local_580._0_8_ = uVar99;
    local_580._16_8_ = uVar99;
    local_580._24_8_ = uVar99;
    auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar94 + 0x484);
    auVar101 = vmovshdup_avx(auVar126);
    uVar99 = auVar101._0_8_;
    local_5a0._8_8_ = uVar99;
    local_5a0._0_8_ = uVar99;
    local_5a0._16_8_ = uVar99;
    local_5a0._24_8_ = uVar99;
    auVar220 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar94 + 0x908);
    uVar222 = auVar174._0_4_;
    local_6e0._4_4_ = uVar222;
    local_6e0._0_4_ = uVar222;
    local_6e0._8_4_ = uVar222;
    local_6e0._12_4_ = uVar222;
    local_6e0._16_4_ = uVar222;
    local_6e0._20_4_ = uVar222;
    local_6e0._24_4_ = uVar222;
    local_6e0._28_4_ = uVar222;
    auVar128 = vmovshdup_avx(auVar174);
    uVar99 = auVar128._0_8_;
    local_620._8_8_ = uVar99;
    local_620._0_8_ = uVar99;
    local_620._16_8_ = uVar99;
    local_620._24_8_ = uVar99;
    pauVar5 = (undefined1 (*) [32])(catmullrom_basis0 + lVar94 + 0xd8c);
    fVar147 = *(float *)*pauVar5;
    fVar120 = *(float *)(catmullrom_basis0 + lVar94 + 0xd90);
    fVar121 = *(float *)(catmullrom_basis0 + lVar94 + 0xd94);
    fVar122 = *(float *)(catmullrom_basis0 + lVar94 + 0xd98);
    fVar123 = *(float *)(catmullrom_basis0 + lVar94 + 0xd9c);
    fVar124 = *(float *)(catmullrom_basis0 + lVar94 + 0xda0);
    fVar125 = *(float *)(catmullrom_basis0 + lVar94 + 0xda4);
    auVar87 = *(undefined1 (*) [28])*pauVar5;
    local_500 = auVar179._0_4_;
    auVar128 = vmovshdup_avx(auVar179);
    local_760 = auVar128._0_8_;
    auVar117._0_4_ = fVar147 * local_500;
    auVar117._4_4_ = fVar120 * local_500;
    auVar117._8_4_ = fVar121 * local_500;
    auVar117._12_4_ = fVar122 * local_500;
    auVar117._16_4_ = fVar123 * local_500;
    auVar117._20_4_ = fVar124 * local_500;
    auVar117._24_4_ = fVar125 * local_500;
    auVar117._28_4_ = 0;
    fVar229 = auVar128._0_4_;
    auVar109._0_4_ = fVar229 * fVar147;
    fVar232 = auVar128._4_4_;
    auVar109._4_4_ = fVar232 * fVar120;
    auVar109._8_4_ = fVar229 * fVar121;
    auVar109._12_4_ = fVar232 * fVar122;
    auVar109._16_4_ = fVar229 * fVar123;
    auVar109._20_4_ = fVar232 * fVar124;
    auVar109._24_4_ = fVar229 * fVar125;
    auVar109._28_4_ = 0;
    auVar128 = vfmadd231ps_fma(auVar117,auVar220,local_6e0);
    auVar159 = vfmadd231ps_fma(auVar109,auVar220,local_620);
    uVar96 = auVar126._0_4_;
    auVar242._4_4_ = uVar96;
    auVar242._0_4_ = uVar96;
    auVar242._8_4_ = uVar96;
    auVar242._12_4_ = uVar96;
    auVar242._16_4_ = uVar96;
    auVar242._20_4_ = uVar96;
    auVar242._24_4_ = uVar96;
    auVar242._28_4_ = uVar96;
    auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar108,auVar242);
    auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar108,local_5a0);
    auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar94);
    uVar96 = auVar100._0_4_;
    auVar236._4_4_ = uVar96;
    auVar236._0_4_ = uVar96;
    auVar236._8_4_ = uVar96;
    auVar236._12_4_ = uVar96;
    auVar236._16_4_ = uVar96;
    auVar236._20_4_ = uVar96;
    auVar236._24_4_ = uVar96;
    auVar236._28_4_ = uVar96;
    auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar109,auVar236);
    auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar109,local_580);
    auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar94 + 0x908);
    pauVar6 = (undefined1 (*) [32])(catmullrom_basis1 + lVar94 + 0xd8c);
    fVar195 = *(float *)*pauVar6;
    fVar196 = *(float *)(catmullrom_basis1 + lVar94 + 0xd90);
    fVar197 = *(float *)(catmullrom_basis1 + lVar94 + 0xd94);
    fVar210 = *(float *)(catmullrom_basis1 + lVar94 + 0xd98);
    fVar212 = *(float *)(catmullrom_basis1 + lVar94 + 0xd9c);
    fVar214 = *(float *)(catmullrom_basis1 + lVar94 + 0xda0);
    fVar74 = *(float *)(catmullrom_basis1 + lVar94 + 0xda4);
    auVar88 = *(undefined1 (*) [28])*pauVar6;
    auVar135._4_4_ = local_500 * fVar196;
    auVar135._0_4_ = local_500 * fVar195;
    auVar135._8_4_ = local_500 * fVar197;
    auVar135._12_4_ = local_500 * fVar210;
    auVar135._16_4_ = local_500 * fVar212;
    auVar135._20_4_ = local_500 * fVar214;
    auVar135._24_4_ = local_500 * fVar74;
    auVar135._28_4_ = local_500;
    auVar167 = vfmadd231ps_fma(auVar135,auVar117,local_6e0);
    auVar204._4_4_ = fVar232 * fVar196;
    auVar204._0_4_ = fVar229 * fVar195;
    auVar204._8_4_ = fVar229 * fVar197;
    auVar204._12_4_ = fVar232 * fVar210;
    auVar204._16_4_ = fVar229 * fVar212;
    auVar204._20_4_ = fVar232 * fVar214;
    auVar204._24_4_ = fVar229 * fVar74;
    auVar204._28_4_ = uVar222;
    auVar180 = vfmadd231ps_fma(auVar204,auVar117,local_620);
    auVar135 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar94 + 0x484);
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar135,auVar242);
    auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar135,local_5a0);
    auVar204 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar94);
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar204,auVar236);
    auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar204,local_580);
    local_400 = ZEXT1632(auVar167);
    local_440 = ZEXT1632(auVar128);
    auVar20 = vsubps_avx(local_400,local_440);
    local_420 = ZEXT1632(auVar180);
    auVar110 = ZEXT1632(auVar159);
    local_460 = vsubps_avx(local_420,auVar110);
    auVar111._0_4_ = auVar20._0_4_ * auVar159._0_4_;
    auVar111._4_4_ = auVar20._4_4_ * auVar159._4_4_;
    auVar111._8_4_ = auVar20._8_4_ * auVar159._8_4_;
    auVar111._12_4_ = auVar20._12_4_ * auVar159._12_4_;
    auVar111._16_4_ = auVar20._16_4_ * 0.0;
    auVar111._20_4_ = auVar20._20_4_ * 0.0;
    auVar111._24_4_ = auVar20._24_4_ * 0.0;
    auVar111._28_4_ = 0;
    fVar233 = local_460._0_4_;
    auVar131._0_4_ = fVar233 * auVar128._0_4_;
    fVar239 = local_460._4_4_;
    auVar131._4_4_ = fVar239 * auVar128._4_4_;
    fVar240 = local_460._8_4_;
    auVar131._8_4_ = fVar240 * auVar128._8_4_;
    fVar241 = local_460._12_4_;
    auVar131._12_4_ = fVar241 * auVar128._12_4_;
    fVar198 = local_460._16_4_;
    auVar131._16_4_ = fVar198 * 0.0;
    fVar206 = local_460._20_4_;
    auVar131._20_4_ = fVar206 * 0.0;
    fVar207 = local_460._24_4_;
    auVar131._24_4_ = fVar207 * 0.0;
    auVar131._28_4_ = 0;
    auVar111 = vsubps_avx(auVar111,auVar131);
    auVar128 = vpermilps_avx(*pauVar1,0xff);
    uVar99 = auVar128._0_8_;
    local_80._8_8_ = uVar99;
    local_80._0_8_ = uVar99;
    local_80._16_8_ = uVar99;
    local_80._24_8_ = uVar99;
    auVar159 = vpermilps_avx(*pauVar2,0xff);
    uVar99 = auVar159._0_8_;
    local_a0._8_8_ = uVar99;
    local_a0._0_8_ = uVar99;
    local_a0._16_8_ = uVar99;
    local_a0._24_8_ = uVar99;
    auVar159 = vpermilps_avx(*pauVar3,0xff);
    uVar99 = auVar159._0_8_;
    local_c0._8_8_ = uVar99;
    local_c0._0_8_ = uVar99;
    local_c0._16_8_ = uVar99;
    local_c0._24_8_ = uVar99;
    auVar84._12_4_ = fStack_914;
    auVar84._0_12_ = *pauVar4;
    auVar159 = vpermilps_avx(auVar84,0xff);
    local_e0 = auVar159._0_8_;
    fVar148 = auVar159._0_4_;
    auVar184._0_4_ = fVar147 * fVar148;
    fVar147 = auVar159._4_4_;
    auVar184._4_4_ = fVar120 * fVar147;
    auVar184._8_4_ = fVar121 * fVar148;
    auVar184._12_4_ = fVar122 * fVar147;
    auVar184._16_4_ = fVar123 * fVar148;
    auVar184._20_4_ = fVar124 * fVar147;
    auVar184._24_4_ = fVar125 * fVar148;
    auVar184._28_4_ = 0;
    auVar159 = vfmadd231ps_fma(auVar184,local_c0,auVar220);
    auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),local_a0,auVar108);
    auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar109,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar175._4_4_ = fVar147 * fVar196;
    auVar175._0_4_ = fVar148 * fVar195;
    auVar175._8_4_ = fVar148 * fVar197;
    auVar175._12_4_ = fVar147 * fVar210;
    auVar175._16_4_ = fVar148 * fVar212;
    auVar175._20_4_ = fVar147 * fVar214;
    auVar175._24_4_ = fVar148 * fVar74;
    auVar175._28_4_ = auVar109._28_4_;
    auVar167 = vfmadd231ps_fma(auVar175,auVar117,local_c0);
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar135,local_a0);
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar204,local_80);
    auVar138._4_4_ = fVar239 * fVar239;
    auVar138._0_4_ = fVar233 * fVar233;
    auVar138._8_4_ = fVar240 * fVar240;
    auVar138._12_4_ = fVar241 * fVar241;
    auVar138._16_4_ = fVar198 * fVar198;
    auVar138._20_4_ = fVar206 * fVar206;
    auVar138._24_4_ = fVar207 * fVar207;
    auVar138._28_4_ = auVar128._4_4_;
    auVar128 = vfmadd231ps_fma(auVar138,auVar20,auVar20);
    auVar175 = vmaxps_avx(ZEXT1632(auVar159),ZEXT1632(auVar167));
    auVar219._4_4_ = auVar175._4_4_ * auVar175._4_4_ * auVar128._4_4_;
    auVar219._0_4_ = auVar175._0_4_ * auVar175._0_4_ * auVar128._0_4_;
    auVar219._8_4_ = auVar175._8_4_ * auVar175._8_4_ * auVar128._8_4_;
    auVar219._12_4_ = auVar175._12_4_ * auVar175._12_4_ * auVar128._12_4_;
    auVar219._16_4_ = auVar175._16_4_ * auVar175._16_4_ * 0.0;
    auVar219._20_4_ = auVar175._20_4_ * auVar175._20_4_ * 0.0;
    auVar219._24_4_ = auVar175._24_4_ * auVar175._24_4_ * 0.0;
    auVar219._28_4_ = auVar175._28_4_;
    auVar230._4_4_ = auVar111._4_4_ * auVar111._4_4_;
    auVar230._0_4_ = auVar111._0_4_ * auVar111._0_4_;
    auVar230._8_4_ = auVar111._8_4_ * auVar111._8_4_;
    auVar230._12_4_ = auVar111._12_4_ * auVar111._12_4_;
    auVar230._16_4_ = auVar111._16_4_ * auVar111._16_4_;
    auVar230._20_4_ = auVar111._20_4_ * auVar111._20_4_;
    auVar230._24_4_ = auVar111._24_4_ * auVar111._24_4_;
    auVar230._28_4_ = auVar111._28_4_;
    local_540._0_4_ = (undefined4)iVar90;
    register0x00001504 = auVar179._4_12_;
    auVar175 = vcmpps_avx(auVar230,auVar219,2);
    fVar148 = auVar149._0_4_ * 4.7683716e-07;
    auVar112._4_4_ = local_540._0_4_;
    auVar112._0_4_ = local_540._0_4_;
    auVar112._8_4_ = local_540._0_4_;
    auVar112._12_4_ = local_540._0_4_;
    auVar112._16_4_ = local_540._0_4_;
    auVar112._20_4_ = local_540._0_4_;
    auVar112._24_4_ = local_540._0_4_;
    auVar112._28_4_ = local_540._0_4_;
    auVar111 = vcmpps_avx(_DAT_01f7b060,auVar112,1);
    auVar149 = vpermilps_avx(auVar100,0xaa);
    uVar99 = auVar149._0_8_;
    local_700._8_8_ = uVar99;
    local_700._0_8_ = uVar99;
    local_700._16_8_ = uVar99;
    local_700._24_8_ = uVar99;
    auVar128 = vpermilps_avx(auVar126,0xaa);
    uVar99 = auVar128._0_8_;
    auVar193._8_8_ = uVar99;
    auVar193._0_8_ = uVar99;
    auVar193._16_8_ = uVar99;
    auVar193._24_8_ = uVar99;
    auVar149 = vpermilps_avx(auVar174,0xaa);
    uVar99 = auVar149._0_8_;
    local_7c0._8_8_ = uVar99;
    local_7c0._0_8_ = uVar99;
    local_7c0._16_8_ = uVar99;
    local_7c0._24_8_ = uVar99;
    auVar231 = ZEXT3264(local_7c0);
    auVar149 = vshufps_avx(auVar179,auVar179,0xaa);
    uVar99 = auVar149._0_8_;
    register0x00001508 = uVar99;
    local_740 = uVar99;
    register0x00001510 = uVar99;
    register0x00001518 = uVar99;
    auVar227 = ZEXT3264(_local_740);
    auVar138 = auVar111 & auVar175;
    uVar8 = *(uint *)(ray + k * 4 + 0x60);
    local_780._0_16_ = ZEXT416(uVar8);
    local_640._0_16_ = ZEXT416(uVar91);
    local_560 = ZEXT416(uVar12);
    uStack_758 = local_760;
    uStack_750 = local_760;
    uStack_748 = local_760;
    fStack_4fc = local_500;
    fStack_4f8 = local_500;
    fStack_4f4 = local_500;
    fStack_4f0 = local_500;
    fStack_4ec = local_500;
    fStack_4e8 = local_500;
    fStack_4e4 = local_500;
    local_560._0_4_ = uVar12;
    if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar138 >> 0x7f,0) == '\0') &&
          (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar138 >> 0xbf,0) == '\0') &&
        (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar138[0x1f])
    {
      auVar146 = ZEXT3264(local_7e0);
      auVar166 = ZEXT3264(local_6e0);
    }
    else {
      _local_4a0 = vandps_avx(auVar175,auVar111);
      local_480._0_4_ = auVar88._0_4_;
      local_480._4_4_ = auVar88._4_4_;
      fStack_478 = auVar88._8_4_;
      fStack_474 = auVar88._12_4_;
      fStack_470 = auVar88._16_4_;
      fStack_46c = auVar88._20_4_;
      fStack_468 = auVar88._24_4_;
      fVar195 = auVar149._0_4_;
      fVar196 = auVar149._4_4_;
      auVar185._4_4_ = fVar196 * (float)local_480._4_4_;
      auVar185._0_4_ = fVar195 * (float)local_480._0_4_;
      auVar185._8_4_ = fVar195 * fStack_478;
      auVar185._12_4_ = fVar196 * fStack_474;
      auVar185._16_4_ = fVar195 * fStack_470;
      auVar185._20_4_ = fVar196 * fStack_46c;
      auVar185._24_4_ = fVar195 * fStack_468;
      auVar185._28_4_ = local_4a0._28_4_;
      auVar149 = vfmadd213ps_fma(auVar117,local_7c0,auVar185);
      auVar149 = vfmadd213ps_fma(auVar135,auVar193,ZEXT1632(auVar149));
      auVar149 = vfmadd213ps_fma(auVar204,local_700,ZEXT1632(auVar149));
      local_520._0_4_ = auVar87._0_4_;
      local_520._4_4_ = auVar87._4_4_;
      fStack_518 = auVar87._8_4_;
      fStack_514 = auVar87._12_4_;
      fStack_510 = auVar87._16_4_;
      fStack_50c = auVar87._20_4_;
      fStack_508 = auVar87._24_4_;
      auVar113._0_4_ = fVar195 * (float)local_520._0_4_;
      auVar113._4_4_ = fVar196 * (float)local_520._4_4_;
      auVar113._8_4_ = fVar195 * fStack_518;
      auVar113._12_4_ = fVar196 * fStack_514;
      auVar113._16_4_ = fVar195 * fStack_510;
      auVar113._20_4_ = fVar196 * fStack_50c;
      auVar113._24_4_ = fVar195 * fStack_508;
      auVar113._28_4_ = 0;
      auVar100 = vfmadd213ps_fma(auVar220,local_7c0,auVar113);
      auVar100 = vfmadd213ps_fma(auVar108,auVar193,ZEXT1632(auVar100));
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar94 + 0x1210);
      auVar220 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar94 + 0x1694);
      auVar117 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar94 + 0x1b18);
      fVar147 = *(float *)(catmullrom_basis0 + lVar94 + 0x1f9c);
      fVar120 = *(float *)(catmullrom_basis0 + lVar94 + 0x1fa0);
      fVar121 = *(float *)(catmullrom_basis0 + lVar94 + 0x1fa4);
      fVar122 = *(float *)(catmullrom_basis0 + lVar94 + 0x1fa8);
      fVar123 = *(float *)(catmullrom_basis0 + lVar94 + 0x1fac);
      fVar124 = *(float *)(catmullrom_basis0 + lVar94 + 0x1fb0);
      fVar125 = *(float *)(catmullrom_basis0 + lVar94 + 0x1fb4);
      auVar21._4_4_ = local_500 * fVar120;
      auVar21._0_4_ = local_500 * fVar147;
      auVar21._8_4_ = local_500 * fVar121;
      auVar21._12_4_ = local_500 * fVar122;
      auVar21._16_4_ = local_500 * fVar123;
      auVar21._20_4_ = local_500 * fVar124;
      auVar21._24_4_ = local_500 * fVar125;
      auVar21._28_4_ = *(undefined4 *)(catmullrom_basis1 + lVar94 + 0xda8);
      auVar22._4_4_ = fVar120 * fVar232;
      auVar22._0_4_ = fVar147 * fVar229;
      auVar22._8_4_ = fVar121 * fVar229;
      auVar22._12_4_ = fVar122 * fVar232;
      auVar22._16_4_ = fVar123 * fVar229;
      auVar22._20_4_ = fVar124 * fVar232;
      auVar22._24_4_ = fVar125 * fVar229;
      auVar22._28_4_ = auVar128._4_4_;
      auVar23._4_4_ = fVar196 * fVar120;
      auVar23._0_4_ = fVar195 * fVar147;
      auVar23._8_4_ = fVar195 * fVar121;
      auVar23._12_4_ = fVar196 * fVar122;
      auVar23._16_4_ = fVar195 * fVar123;
      auVar23._20_4_ = fVar196 * fVar124;
      auVar23._24_4_ = fVar195 * fVar125;
      auVar23._28_4_ = auVar101._4_4_;
      auVar101 = vfmadd231ps_fma(auVar21,auVar117,local_6e0);
      auVar126 = vfmadd231ps_fma(auVar22,auVar117,local_620);
      auVar174 = vfmadd231ps_fma(auVar23,local_7c0,auVar117);
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar220,auVar242);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar220,local_5a0);
      auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar193,auVar220);
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar108,auVar236);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar108,local_580);
      auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar108,local_700);
      fVar147 = *(float *)(catmullrom_basis1 + lVar94 + 0x1f9c);
      fVar120 = *(float *)(catmullrom_basis1 + lVar94 + 0x1fa0);
      fVar121 = *(float *)(catmullrom_basis1 + lVar94 + 0x1fa4);
      fVar122 = *(float *)(catmullrom_basis1 + lVar94 + 0x1fa8);
      fVar123 = *(float *)(catmullrom_basis1 + lVar94 + 0x1fac);
      fVar124 = *(float *)(catmullrom_basis1 + lVar94 + 0x1fb0);
      fVar125 = *(float *)(catmullrom_basis1 + lVar94 + 0x1fb4);
      auVar220._4_4_ = local_500 * fVar120;
      auVar220._0_4_ = local_500 * fVar147;
      auVar220._8_4_ = local_500 * fVar121;
      auVar220._12_4_ = local_500 * fVar122;
      auVar220._16_4_ = local_500 * fVar123;
      auVar220._20_4_ = local_500 * fVar124;
      auVar220._24_4_ = local_500 * fVar125;
      auVar220._28_4_ = auVar128._4_4_;
      auVar24._4_4_ = fVar232 * fVar120;
      auVar24._0_4_ = fVar229 * fVar147;
      auVar24._8_4_ = fVar229 * fVar121;
      auVar24._12_4_ = fVar232 * fVar122;
      auVar24._16_4_ = fVar229 * fVar123;
      auVar24._20_4_ = fVar232 * fVar124;
      auVar24._24_4_ = fVar229 * fVar125;
      auVar24._28_4_ = local_500;
      auVar25._4_4_ = fVar196 * fVar120;
      auVar25._0_4_ = fVar195 * fVar147;
      auVar25._8_4_ = fVar195 * fVar121;
      auVar25._12_4_ = fVar196 * fVar122;
      auVar25._16_4_ = fVar195 * fVar123;
      auVar25._20_4_ = fVar196 * fVar124;
      auVar25._24_4_ = fVar195 * fVar125;
      auVar25._28_4_ = fVar196;
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar94 + 0x1b18);
      auVar128 = vfmadd231ps_fma(auVar220,auVar108,local_6e0);
      auVar179 = vfmadd231ps_fma(auVar24,auVar108,local_620);
      auVar180 = vfmadd231ps_fma(auVar25,local_7c0,auVar108);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar94 + 0x1694);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar108,auVar242);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar108,local_5a0);
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar108,auVar193);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar94 + 0x1210);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar108,auVar236);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar108,local_580);
      auVar132._8_4_ = 0x7fffffff;
      auVar132._0_8_ = 0x7fffffff7fffffff;
      auVar132._12_4_ = 0x7fffffff;
      auVar132._16_4_ = 0x7fffffff;
      auVar132._20_4_ = 0x7fffffff;
      auVar132._24_4_ = 0x7fffffff;
      auVar132._28_4_ = 0x7fffffff;
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),local_700,auVar108);
      auVar108 = vandps_avx(ZEXT1632(auVar101),auVar132);
      auVar220 = vandps_avx(ZEXT1632(auVar126),auVar132);
      auVar220 = vmaxps_avx(auVar108,auVar220);
      auVar108 = vandps_avx(ZEXT1632(auVar174),auVar132);
      auVar108 = vmaxps_avx(auVar220,auVar108);
      auVar156._4_4_ = fVar148;
      auVar156._0_4_ = fVar148;
      auVar156._8_4_ = fVar148;
      auVar156._12_4_ = fVar148;
      auVar156._16_4_ = fVar148;
      auVar156._20_4_ = fVar148;
      auVar156._24_4_ = fVar148;
      auVar156._28_4_ = fVar148;
      auVar108 = vcmpps_avx(auVar108,auVar156,1);
      auVar117 = vblendvps_avx(ZEXT1632(auVar101),auVar20,auVar108);
      auVar135 = vblendvps_avx(ZEXT1632(auVar126),local_460,auVar108);
      auVar108 = vandps_avx(ZEXT1632(auVar128),auVar132);
      auVar220 = vandps_avx(ZEXT1632(auVar179),auVar132);
      auVar204 = vmaxps_avx(auVar108,auVar220);
      auVar108 = vandps_avx(ZEXT1632(auVar180),auVar132);
      auVar108 = vmaxps_avx(auVar204,auVar108);
      auVar175 = vcmpps_avx(auVar108,auVar156,1);
      auVar108 = vblendvps_avx(ZEXT1632(auVar128),auVar20,auVar175);
      auVar204 = vblendvps_avx(ZEXT1632(auVar179),local_460,auVar175);
      auVar101 = vfmadd213ps_fma(auVar109,local_700,ZEXT1632(auVar100));
      auVar128 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar135,auVar135);
      auVar109 = vrsqrtps_avx(ZEXT1632(auVar128));
      fVar147 = auVar109._0_4_;
      fVar120 = auVar109._4_4_;
      fVar121 = auVar109._8_4_;
      fVar122 = auVar109._12_4_;
      fVar123 = auVar109._16_4_;
      fVar124 = auVar109._20_4_;
      fVar125 = auVar109._24_4_;
      auVar20._4_4_ = fVar120 * fVar120 * fVar120 * auVar128._4_4_ * -0.5;
      auVar20._0_4_ = fVar147 * fVar147 * fVar147 * auVar128._0_4_ * -0.5;
      auVar20._8_4_ = fVar121 * fVar121 * fVar121 * auVar128._8_4_ * -0.5;
      auVar20._12_4_ = fVar122 * fVar122 * fVar122 * auVar128._12_4_ * -0.5;
      auVar20._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
      auVar20._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar20._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar20._28_4_ = auVar220._28_4_;
      auVar237._8_4_ = 0x3fc00000;
      auVar237._0_8_ = 0x3fc000003fc00000;
      auVar237._12_4_ = 0x3fc00000;
      auVar237._16_4_ = 0x3fc00000;
      auVar237._20_4_ = 0x3fc00000;
      auVar237._24_4_ = 0x3fc00000;
      auVar237._28_4_ = 0x3fc00000;
      auVar128 = vfmadd231ps_fma(auVar20,auVar237,auVar109);
      fVar147 = auVar128._0_4_;
      fVar120 = auVar128._4_4_;
      auVar26._4_4_ = fVar120 * auVar135._4_4_;
      auVar26._0_4_ = fVar147 * auVar135._0_4_;
      fVar121 = auVar128._8_4_;
      auVar26._8_4_ = fVar121 * auVar135._8_4_;
      fVar122 = auVar128._12_4_;
      auVar26._12_4_ = fVar122 * auVar135._12_4_;
      auVar26._16_4_ = auVar135._16_4_ * 0.0;
      auVar26._20_4_ = auVar135._20_4_ * 0.0;
      auVar26._24_4_ = auVar135._24_4_ * 0.0;
      auVar26._28_4_ = 0;
      auVar27._4_4_ = fVar120 * -auVar117._4_4_;
      auVar27._0_4_ = fVar147 * -auVar117._0_4_;
      auVar27._8_4_ = fVar121 * -auVar117._8_4_;
      auVar27._12_4_ = fVar122 * -auVar117._12_4_;
      auVar27._16_4_ = -auVar117._16_4_ * 0.0;
      auVar27._20_4_ = -auVar117._20_4_ * 0.0;
      auVar27._24_4_ = -auVar117._24_4_ * 0.0;
      auVar27._28_4_ = auVar109._28_4_;
      auVar128 = vfmadd213ps_fma(auVar108,auVar108,ZEXT832(0) << 0x20);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar204,auVar204);
      auVar220 = vrsqrtps_avx(ZEXT1632(auVar128));
      auVar28._28_4_ = auVar175._28_4_;
      auVar28._0_28_ =
           ZEXT1628(CONCAT412(fVar122 * 0.0,
                              CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar147 * 0.0))));
      fVar147 = auVar220._0_4_;
      fVar120 = auVar220._4_4_;
      fVar121 = auVar220._8_4_;
      fVar122 = auVar220._12_4_;
      fVar123 = auVar220._16_4_;
      fVar124 = auVar220._20_4_;
      fVar125 = auVar220._24_4_;
      auVar29._4_4_ = fVar120 * fVar120 * fVar120 * auVar128._4_4_ * -0.5;
      auVar29._0_4_ = fVar147 * fVar147 * fVar147 * auVar128._0_4_ * -0.5;
      auVar29._8_4_ = fVar121 * fVar121 * fVar121 * auVar128._8_4_ * -0.5;
      auVar29._12_4_ = fVar122 * fVar122 * fVar122 * auVar128._12_4_ * -0.5;
      auVar29._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
      auVar29._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar29._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar29._28_4_ = 0;
      auVar128 = vfmadd231ps_fma(auVar29,auVar237,auVar220);
      fVar147 = auVar128._0_4_;
      auVar217._0_4_ = auVar204._0_4_ * fVar147;
      fVar120 = auVar128._4_4_;
      auVar217._4_4_ = auVar204._4_4_ * fVar120;
      fVar121 = auVar128._8_4_;
      auVar217._8_4_ = auVar204._8_4_ * fVar121;
      fVar122 = auVar128._12_4_;
      auVar217._12_4_ = auVar204._12_4_ * fVar122;
      auVar217._16_4_ = auVar204._16_4_ * 0.0;
      auVar217._20_4_ = auVar204._20_4_ * 0.0;
      auVar217._24_4_ = auVar204._24_4_ * 0.0;
      auVar217._28_4_ = 0;
      auVar30._4_4_ = -auVar108._4_4_ * fVar120;
      auVar30._0_4_ = -auVar108._0_4_ * fVar147;
      auVar30._8_4_ = -auVar108._8_4_ * fVar121;
      auVar30._12_4_ = -auVar108._12_4_ * fVar122;
      auVar30._16_4_ = -auVar108._16_4_ * 0.0;
      auVar30._20_4_ = -auVar108._20_4_ * 0.0;
      auVar30._24_4_ = -auVar108._24_4_ * 0.0;
      auVar30._28_4_ = auVar204._28_4_;
      auVar31._28_4_ = auVar220._28_4_;
      auVar31._0_28_ =
           ZEXT1628(CONCAT412(fVar122 * 0.0,
                              CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar147 * 0.0))));
      auVar128 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar159),local_440);
      auVar108 = ZEXT1632(auVar159);
      auVar100 = vfmadd213ps_fma(auVar27,auVar108,auVar110);
      auVar126 = vfmadd213ps_fma(auVar28,auVar108,ZEXT1632(auVar101));
      auVar180 = vfnmadd213ps_fma(auVar26,auVar108,local_440);
      auVar174 = vfmadd213ps_fma(auVar217,ZEXT1632(auVar167),local_400);
      auVar181 = vfnmadd213ps_fma(auVar27,auVar108,auVar110);
      auVar108 = ZEXT1632(auVar167);
      auVar179 = vfmadd213ps_fma(auVar30,auVar108,local_420);
      auVar185 = ZEXT1632(auVar159);
      auVar192 = vfnmadd231ps_fma(ZEXT1632(auVar101),auVar185,auVar28);
      auVar101 = vfmadd213ps_fma(auVar31,auVar108,ZEXT1632(auVar149));
      auVar188 = vfnmadd213ps_fma(auVar217,auVar108,local_400);
      auVar189 = vfnmadd213ps_fma(auVar30,auVar108,local_420);
      _local_5c0 = ZEXT1632(auVar167);
      auVar199 = vfnmadd231ps_fma(ZEXT1632(auVar149),_local_5c0,auVar31);
      auVar108 = vsubps_avx(ZEXT1632(auVar179),ZEXT1632(auVar181));
      auVar220 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar192));
      auVar110._4_4_ = auVar192._4_4_ * auVar108._4_4_;
      auVar110._0_4_ = auVar192._0_4_ * auVar108._0_4_;
      auVar110._8_4_ = auVar192._8_4_ * auVar108._8_4_;
      auVar110._12_4_ = auVar192._12_4_ * auVar108._12_4_;
      auVar110._16_4_ = auVar108._16_4_ * 0.0;
      auVar110._20_4_ = auVar108._20_4_ * 0.0;
      auVar110._24_4_ = auVar108._24_4_ * 0.0;
      auVar110._28_4_ = 0;
      auVar159 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar181),auVar220);
      auVar32._4_4_ = auVar220._4_4_ * auVar180._4_4_;
      auVar32._0_4_ = auVar220._0_4_ * auVar180._0_4_;
      auVar32._8_4_ = auVar220._8_4_ * auVar180._8_4_;
      auVar32._12_4_ = auVar220._12_4_ * auVar180._12_4_;
      auVar32._16_4_ = auVar220._16_4_ * 0.0;
      auVar32._20_4_ = auVar220._20_4_ * 0.0;
      auVar32._24_4_ = auVar220._24_4_ * 0.0;
      auVar32._28_4_ = auVar220._28_4_;
      auVar220 = vsubps_avx(ZEXT1632(auVar174),ZEXT1632(auVar180));
      auVar149 = vfmsub231ps_fma(auVar32,ZEXT1632(auVar192),auVar220);
      auVar33._4_4_ = auVar181._4_4_ * auVar220._4_4_;
      auVar33._0_4_ = auVar181._0_4_ * auVar220._0_4_;
      auVar33._8_4_ = auVar181._8_4_ * auVar220._8_4_;
      auVar33._12_4_ = auVar181._12_4_ * auVar220._12_4_;
      auVar33._16_4_ = auVar220._16_4_ * 0.0;
      auVar33._20_4_ = auVar220._20_4_ * 0.0;
      auVar33._24_4_ = auVar220._24_4_ * 0.0;
      auVar33._28_4_ = auVar220._28_4_;
      auVar175 = ZEXT1632(auVar180);
      auVar167 = vfmsub231ps_fma(auVar33,auVar175,auVar108);
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar167),ZEXT832(0) << 0x20,ZEXT1632(auVar149));
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),ZEXT832(0) << 0x20,ZEXT1632(auVar159));
      auVar138 = vcmpps_avx(ZEXT1632(auVar149),ZEXT832(0) << 0x20,2);
      auVar108 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar128),auVar138);
      auVar220 = vblendvps_avx(ZEXT1632(auVar189),ZEXT1632(auVar100),auVar138);
      auVar109 = vblendvps_avx(ZEXT1632(auVar199),ZEXT1632(auVar126),auVar138);
      auVar117 = vblendvps_avx(auVar175,ZEXT1632(auVar174),auVar138);
      auVar135 = vblendvps_avx(ZEXT1632(auVar181),ZEXT1632(auVar179),auVar138);
      auVar204 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar101),auVar138);
      auVar175 = vblendvps_avx(ZEXT1632(auVar174),auVar175,auVar138);
      auVar111 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar181),auVar138);
      auVar149 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
      auVar20 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar192),auVar138);
      auVar219 = vsubps_avx(auVar175,auVar108);
      auVar230 = vsubps_avx(auVar111,auVar220);
      auVar110 = vsubps_avx(auVar20,auVar109);
      auVar112 = vsubps_avx(auVar108,auVar117);
      auVar131 = vsubps_avx(auVar220,auVar135);
      auVar184 = vsubps_avx(auVar109,auVar204);
      auVar34._4_4_ = auVar110._4_4_ * auVar108._4_4_;
      auVar34._0_4_ = auVar110._0_4_ * auVar108._0_4_;
      auVar34._8_4_ = auVar110._8_4_ * auVar108._8_4_;
      auVar34._12_4_ = auVar110._12_4_ * auVar108._12_4_;
      auVar34._16_4_ = auVar110._16_4_ * auVar108._16_4_;
      auVar34._20_4_ = auVar110._20_4_ * auVar108._20_4_;
      auVar34._24_4_ = auVar110._24_4_ * auVar108._24_4_;
      auVar34._28_4_ = auVar20._28_4_;
      auVar101 = vfmsub231ps_fma(auVar34,auVar109,auVar219);
      auVar35._4_4_ = auVar219._4_4_ * auVar220._4_4_;
      auVar35._0_4_ = auVar219._0_4_ * auVar220._0_4_;
      auVar35._8_4_ = auVar219._8_4_ * auVar220._8_4_;
      auVar35._12_4_ = auVar219._12_4_ * auVar220._12_4_;
      auVar35._16_4_ = auVar219._16_4_ * auVar220._16_4_;
      auVar35._20_4_ = auVar219._20_4_ * auVar220._20_4_;
      auVar35._24_4_ = auVar219._24_4_ * auVar220._24_4_;
      auVar35._28_4_ = auVar175._28_4_;
      auVar128 = vfmsub231ps_fma(auVar35,auVar108,auVar230);
      auVar73 = ZEXT812(0);
      auVar218 = ZEXT1232(auVar73) << 0x20;
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar128),ZEXT1232(auVar73) << 0x20,ZEXT1632(auVar101));
      auVar114._0_4_ = auVar230._0_4_ * auVar109._0_4_;
      auVar114._4_4_ = auVar230._4_4_ * auVar109._4_4_;
      auVar114._8_4_ = auVar230._8_4_ * auVar109._8_4_;
      auVar114._12_4_ = auVar230._12_4_ * auVar109._12_4_;
      auVar114._16_4_ = auVar230._16_4_ * auVar109._16_4_;
      auVar114._20_4_ = auVar230._20_4_ * auVar109._20_4_;
      auVar114._24_4_ = auVar230._24_4_ * auVar109._24_4_;
      auVar114._28_4_ = 0;
      auVar128 = vfmsub231ps_fma(auVar114,auVar220,auVar110);
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1232(auVar73) << 0x20,ZEXT1632(auVar128));
      auVar115._0_4_ = auVar184._0_4_ * auVar117._0_4_;
      auVar115._4_4_ = auVar184._4_4_ * auVar117._4_4_;
      auVar115._8_4_ = auVar184._8_4_ * auVar117._8_4_;
      auVar115._12_4_ = auVar184._12_4_ * auVar117._12_4_;
      auVar115._16_4_ = auVar184._16_4_ * auVar117._16_4_;
      auVar115._20_4_ = auVar184._20_4_ * auVar117._20_4_;
      auVar115._24_4_ = auVar184._24_4_ * auVar117._24_4_;
      auVar115._28_4_ = 0;
      auVar101 = vfmsub231ps_fma(auVar115,auVar112,auVar204);
      auVar36._4_4_ = auVar131._4_4_ * auVar204._4_4_;
      auVar36._0_4_ = auVar131._0_4_ * auVar204._0_4_;
      auVar36._8_4_ = auVar131._8_4_ * auVar204._8_4_;
      auVar36._12_4_ = auVar131._12_4_ * auVar204._12_4_;
      auVar36._16_4_ = auVar131._16_4_ * auVar204._16_4_;
      auVar36._20_4_ = auVar131._20_4_ * auVar204._20_4_;
      auVar36._24_4_ = auVar131._24_4_ * auVar204._24_4_;
      auVar36._28_4_ = auVar204._28_4_;
      auVar159 = vfmsub231ps_fma(auVar36,auVar135,auVar184);
      auVar37._4_4_ = auVar112._4_4_ * auVar135._4_4_;
      auVar37._0_4_ = auVar112._0_4_ * auVar135._0_4_;
      auVar37._8_4_ = auVar112._8_4_ * auVar135._8_4_;
      auVar37._12_4_ = auVar112._12_4_ * auVar135._12_4_;
      auVar37._16_4_ = auVar112._16_4_ * auVar135._16_4_;
      auVar37._20_4_ = auVar112._20_4_ * auVar135._20_4_;
      auVar37._24_4_ = auVar112._24_4_ * auVar135._24_4_;
      auVar37._28_4_ = auVar111._28_4_;
      auVar167 = vfmsub231ps_fma(auVar37,auVar131,auVar117);
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar167),ZEXT1232(auVar73) << 0x20,ZEXT1632(auVar101));
      auVar159 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1232(auVar73) << 0x20,ZEXT1632(auVar159));
      auVar117 = vmaxps_avx(ZEXT1632(auVar128),ZEXT1632(auVar159));
      auVar117 = vcmpps_avx(auVar117,ZEXT832(0) << 0x20,2);
      auVar101 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
      auVar149 = vpand_avx(auVar101,auVar149);
      auVar117 = vpmovsxwd_avx2(auVar149);
      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0x7f,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0xbf,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar117[0x1f]) {
        auVar146 = ZEXT864(0) << 0x20;
LAB_0117e3d2:
        auVar231 = ZEXT3264(CONCAT824(uStack_648,
                                      CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
        auVar108 = vpcmpeqd_avx2(auVar218,auVar218);
        auVar166 = ZEXT3264(auVar108);
      }
      else {
        auVar38._4_4_ = auVar230._4_4_ * auVar184._4_4_;
        auVar38._0_4_ = auVar230._0_4_ * auVar184._0_4_;
        auVar38._8_4_ = auVar230._8_4_ * auVar184._8_4_;
        auVar38._12_4_ = auVar230._12_4_ * auVar184._12_4_;
        auVar38._16_4_ = auVar230._16_4_ * auVar184._16_4_;
        auVar38._20_4_ = auVar230._20_4_ * auVar184._20_4_;
        auVar38._24_4_ = auVar230._24_4_ * auVar184._24_4_;
        auVar38._28_4_ = auVar117._28_4_;
        auVar126 = vfmsub231ps_fma(auVar38,auVar131,auVar110);
        auVar133._0_4_ = auVar110._0_4_ * auVar112._0_4_;
        auVar133._4_4_ = auVar110._4_4_ * auVar112._4_4_;
        auVar133._8_4_ = auVar110._8_4_ * auVar112._8_4_;
        auVar133._12_4_ = auVar110._12_4_ * auVar112._12_4_;
        auVar133._16_4_ = auVar110._16_4_ * auVar112._16_4_;
        auVar133._20_4_ = auVar110._20_4_ * auVar112._20_4_;
        auVar133._24_4_ = auVar110._24_4_ * auVar112._24_4_;
        auVar133._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar133,auVar219,auVar184);
        auVar39._4_4_ = auVar219._4_4_ * auVar131._4_4_;
        auVar39._0_4_ = auVar219._0_4_ * auVar131._0_4_;
        auVar39._8_4_ = auVar219._8_4_ * auVar131._8_4_;
        auVar39._12_4_ = auVar219._12_4_ * auVar131._12_4_;
        auVar39._16_4_ = auVar219._16_4_ * auVar131._16_4_;
        auVar39._20_4_ = auVar219._20_4_ * auVar131._20_4_;
        auVar39._24_4_ = auVar219._24_4_ * auVar131._24_4_;
        auVar39._28_4_ = auVar135._28_4_;
        auVar174 = vfmsub231ps_fma(auVar39,auVar112,auVar230);
        auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar174));
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar126),_DAT_01f7b000);
        auVar117 = vrcpps_avx(ZEXT1632(auVar167));
        auVar218._8_4_ = 0x3f800000;
        auVar218._0_8_ = 0x3f8000003f800000;
        auVar218._12_4_ = 0x3f800000;
        auVar218._16_4_ = 0x3f800000;
        auVar218._20_4_ = 0x3f800000;
        auVar218._24_4_ = 0x3f800000;
        auVar218._28_4_ = 0x3f800000;
        auVar101 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar167),auVar218);
        auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar117,auVar117);
        auVar186._0_4_ = auVar174._0_4_ * auVar109._0_4_;
        auVar186._4_4_ = auVar174._4_4_ * auVar109._4_4_;
        auVar186._8_4_ = auVar174._8_4_ * auVar109._8_4_;
        auVar186._12_4_ = auVar174._12_4_ * auVar109._12_4_;
        auVar186._16_4_ = auVar109._16_4_ * 0.0;
        auVar186._20_4_ = auVar109._20_4_ * 0.0;
        auVar186._24_4_ = auVar109._24_4_ * 0.0;
        auVar186._28_4_ = 0;
        auVar100 = vfmadd231ps_fma(auVar186,auVar220,ZEXT1632(auVar100));
        auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar126),auVar108);
        fVar147 = auVar101._0_4_;
        fVar120 = auVar101._4_4_;
        fVar121 = auVar101._8_4_;
        fVar122 = auVar101._12_4_;
        auVar109 = ZEXT1632(CONCAT412(fVar122 * auVar100._12_4_,
                                      CONCAT48(fVar121 * auVar100._8_4_,
                                               CONCAT44(fVar120 * auVar100._4_4_,
                                                        fVar147 * auVar100._0_4_))));
        auVar116._4_4_ = uVar8;
        auVar116._0_4_ = uVar8;
        auVar116._8_4_ = uVar8;
        auVar116._12_4_ = uVar8;
        auVar116._16_4_ = uVar8;
        auVar116._20_4_ = uVar8;
        auVar116._24_4_ = uVar8;
        auVar116._28_4_ = uVar8;
        uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar134._4_4_ = uVar96;
        auVar134._0_4_ = uVar96;
        auVar134._8_4_ = uVar96;
        auVar134._12_4_ = uVar96;
        auVar134._16_4_ = uVar96;
        auVar134._20_4_ = uVar96;
        auVar134._24_4_ = uVar96;
        auVar134._28_4_ = uVar96;
        auVar108 = vcmpps_avx(auVar116,auVar109,2);
        auVar220 = vcmpps_avx(auVar109,auVar134,2);
        auVar108 = vandps_avx(auVar220,auVar108);
        auVar101 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
        auVar149 = vpand_avx(auVar149,auVar101);
        auVar108 = vpmovsxwd_avx2(auVar149);
        auVar146 = ZEXT864(0) << 0x20;
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0x7f,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0xbf,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar108[0x1f]) goto LAB_0117e3d2;
        auVar108 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar167),4);
        auVar101 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
        auVar149 = vpand_avx(auVar149,auVar101);
        auVar220 = vpmovsxwd_avx2(auVar149);
        auVar231 = ZEXT3264(CONCAT824(uStack_648,
                                      CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
        auVar108 = vpcmpeqd_avx2(auVar218,auVar218);
        auVar166 = ZEXT3264(auVar108);
        if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar220 >> 0x7f,0) != '\0') ||
              (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar220 >> 0xbf,0) != '\0') ||
            (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar220[0x1f] < '\0') {
          auVar117 = ZEXT1632(CONCAT412(fVar122 * auVar128._12_4_,
                                        CONCAT48(fVar121 * auVar128._8_4_,
                                                 CONCAT44(fVar120 * auVar128._4_4_,
                                                          fVar147 * auVar128._0_4_))));
          auVar135 = ZEXT1632(CONCAT412(fVar122 * auVar159._12_4_,
                                        CONCAT48(fVar121 * auVar159._8_4_,
                                                 CONCAT44(fVar120 * auVar159._4_4_,
                                                          fVar147 * auVar159._0_4_))));
          auVar173._8_4_ = 0x3f800000;
          auVar173._0_8_ = 0x3f8000003f800000;
          auVar173._12_4_ = 0x3f800000;
          auVar173._16_4_ = 0x3f800000;
          auVar173._20_4_ = 0x3f800000;
          auVar173._24_4_ = 0x3f800000;
          auVar173._28_4_ = 0x3f800000;
          auVar108 = vsubps_avx(auVar173,auVar117);
          _local_260 = vblendvps_avx(auVar108,auVar117,auVar138);
          auVar108 = vsubps_avx(auVar173,auVar135);
          local_4c0 = vblendvps_avx(auVar108,auVar135,auVar138);
          auVar231 = ZEXT3264(auVar220);
          local_5e0 = auVar109;
        }
      }
      auVar227 = ZEXT3264(_local_740);
      auVar205 = ZEXT3264(local_7c0);
      auVar108 = auVar231._0_32_;
      if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar108 >> 0x7f,0) != '\0') ||
            (auVar231 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar108 >> 0xbf,0) != '\0') ||
          (auVar231 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar231[0x1f] < '\0') {
        auVar220 = vsubps_avx(_local_5c0,auVar185);
        auVar149 = vfmadd213ps_fma(auVar220,_local_260,auVar185);
        fVar147 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar40._4_4_ = (auVar149._4_4_ + auVar149._4_4_) * fVar147;
        auVar40._0_4_ = (auVar149._0_4_ + auVar149._0_4_) * fVar147;
        auVar40._8_4_ = (auVar149._8_4_ + auVar149._8_4_) * fVar147;
        auVar40._12_4_ = (auVar149._12_4_ + auVar149._12_4_) * fVar147;
        auVar40._16_4_ = fVar147 * 0.0;
        auVar40._20_4_ = fVar147 * 0.0;
        auVar40._24_4_ = fVar147 * 0.0;
        auVar40._28_4_ = 0;
        auVar220 = vcmpps_avx(local_5e0,auVar40,6);
        auVar109 = auVar108 & auVar220;
        auVar221 = ZEXT3264(auVar193);
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          auVar136._8_4_ = 0xbf800000;
          auVar136._0_8_ = 0xbf800000bf800000;
          auVar136._12_4_ = 0xbf800000;
          auVar136._16_4_ = 0xbf800000;
          auVar136._20_4_ = 0xbf800000;
          auVar136._24_4_ = 0xbf800000;
          auVar136._28_4_ = 0xbf800000;
          auVar157._8_4_ = 0x40000000;
          auVar157._0_8_ = 0x4000000040000000;
          auVar157._12_4_ = 0x40000000;
          auVar157._16_4_ = 0x40000000;
          auVar157._20_4_ = 0x40000000;
          auVar157._24_4_ = 0x40000000;
          auVar157._28_4_ = 0x40000000;
          auVar149 = vfmadd213ps_fma(local_4c0,auVar157,auVar136);
          local_3c0 = _local_260;
          local_3a0 = ZEXT1632(auVar149);
          local_380 = local_5e0;
          local_360 = 0;
          auVar231 = ZEXT3264(local_7c0);
          local_4c0 = local_3a0;
          if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_6c0 = vandps_avx(auVar220,auVar108);
            fVar147 = 1.0 / (float)local_540._0_4_;
            local_2e0[0] = fVar147 * ((float)local_260._0_4_ + 0.0);
            local_2e0[1] = fVar147 * ((float)local_260._4_4_ + 1.0);
            local_2e0[2] = fVar147 * (fStack_258 + 2.0);
            local_2e0[3] = fVar147 * (fStack_254 + 3.0);
            fStack_2d0 = fVar147 * (fStack_250 + 4.0);
            fStack_2cc = fVar147 * (fStack_24c + 5.0);
            fStack_2c8 = fVar147 * (fStack_248 + 6.0);
            fStack_2c4 = fStack_244 + 7.0;
            local_4c0._0_8_ = auVar149._0_8_;
            local_4c0._8_8_ = auVar149._8_8_;
            local_2c0 = local_4c0._0_8_;
            uStack_2b8 = local_4c0._8_8_;
            uStack_2b0 = 0;
            uStack_2a8 = 0;
            local_2a0 = local_5e0;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar137,local_5e0,local_6c0);
            auVar220 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar220 = vminps_avx(auVar108,auVar220);
            auVar109 = vshufpd_avx(auVar220,auVar220,5);
            auVar220 = vminps_avx(auVar220,auVar109);
            auVar109 = vpermpd_avx2(auVar220,0x4e);
            auVar220 = vminps_avx(auVar220,auVar109);
            auVar220 = vcmpps_avx(auVar108,auVar220,0);
            auVar109 = local_6c0 & auVar220;
            auVar108 = local_6c0;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0x7f,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0xbf,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar109[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar220,local_6c0);
            }
            uVar92 = vmovmskps_avx(auVar108);
            uVar8 = 0;
            for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
              uVar8 = uVar8 + 1;
            }
            uVar93 = (ulong)uVar8;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar147 = local_2e0[uVar93];
              fVar120 = 1.0 - fVar147;
              auVar105 = ZEXT416((uint)fVar147);
              auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,ZEXT416(0xc0a00000))
              ;
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * 3.0)),
                                        ZEXT416((uint)(fVar147 + fVar147)),auVar15);
              auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,ZEXT416(0x40000000))
              ;
              auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar120 * fVar120 * -3.0)),
                                        ZEXT416((uint)(fVar120 + fVar120)),auVar15);
              auVar149 = vfnmadd231ss_fma(ZEXT416((uint)(fVar147 * (fVar120 + fVar120))),
                                          ZEXT416((uint)fVar120),ZEXT416((uint)fVar120));
              auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),auVar105,
                                         ZEXT416((uint)(fVar120 * -2.0)));
              fVar120 = auVar15._0_4_ * 0.5;
              fVar121 = auVar105._0_4_ * 0.5;
              auVar160._0_4_ = fVar121 * local_920;
              auVar160._4_4_ = fVar121 * fStack_91c;
              auVar160._8_4_ = fVar121 * fStack_918;
              auVar160._12_4_ = fVar121 * fStack_914;
              auVar129._4_4_ = fVar120;
              auVar129._0_4_ = fVar120;
              auVar129._8_4_ = fVar120;
              auVar129._12_4_ = fVar120;
              auVar15 = vfmadd132ps_fma(auVar129,auVar160,*pauVar3);
              fVar120 = auVar16._0_4_ * 0.5;
              auVar161._4_4_ = fVar120;
              auVar161._0_4_ = fVar120;
              auVar161._8_4_ = fVar120;
              auVar161._12_4_ = fVar120;
              auVar15 = vfmadd132ps_fma(auVar161,auVar15,*pauVar2);
              uVar96 = *(undefined4 *)((long)&local_2c0 + uVar93 * 4);
              fVar120 = auVar149._0_4_ * 0.5;
              auVar150._4_4_ = fVar120;
              auVar150._0_4_ = fVar120;
              auVar150._8_4_ = fVar120;
              auVar150._12_4_ = fVar120;
              auVar15 = vfmadd132ps_fma(auVar150,auVar15,*pauVar1);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar93 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar15._0_4_;
              uVar222 = vextractps_avx(auVar15,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar222;
              uVar222 = vextractps_avx(auVar15,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar222;
              *(float *)(ray + k * 4 + 0x1e0) = fVar147;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar96;
              *(uint *)(ray + k * 4 + 0x220) = uVar12;
              *(uint *)(ray + k * 4 + 0x240) = uVar91;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_8e0 = CONCAT44(uVar91,uVar91);
              uStack_8d8._0_4_ = uVar91;
              uStack_8d8._4_4_ = uVar91;
              uStack_8d0._0_4_ = uVar91;
              uStack_8d0._4_4_ = uVar91;
              auVar89 = _local_8e0;
              uStack_8c8._0_4_ = uVar91;
              uStack_8c8._4_4_ = uVar91;
              auVar108 = _local_8e0;
              local_720._4_4_ = uVar12;
              local_720._0_4_ = uVar12;
              local_720._8_4_ = uVar12;
              local_720._12_4_ = uVar12;
              local_720._16_4_ = uVar12;
              local_720._20_4_ = uVar12;
              local_720._24_4_ = uVar12;
              local_720._28_4_ = uVar12;
              uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_7f8 = context;
              local_7f0 = k;
              local_7a0 = auVar193;
              _local_520 = *pauVar5;
              _local_480 = *pauVar6;
              local_35c = iVar90;
              local_350 = uVar75;
              uStack_348 = uVar76;
              local_340 = uVar77;
              uStack_338 = uVar78;
              local_330 = uVar79;
              uStack_328 = uVar80;
              local_320 = uVar81;
              uStack_318 = uVar82;
              while( true ) {
                fVar147 = local_2e0[uVar93];
                auVar107._4_4_ = fVar147;
                auVar107._0_4_ = fVar147;
                auVar107._8_4_ = fVar147;
                auVar107._12_4_ = fVar147;
                local_1e0._16_4_ = fVar147;
                local_1e0._0_16_ = auVar107;
                local_1e0._20_4_ = fVar147;
                local_1e0._24_4_ = fVar147;
                local_1e0._28_4_ = fVar147;
                local_1c0 = *(undefined4 *)((long)&local_2c0 + uVar93 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar93 * 4);
                fVar120 = 1.0 - fVar147;
                auVar149 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar107,
                                           ZEXT416(0xc0a00000));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * 3.0)),
                                           ZEXT416((uint)(fVar147 + fVar147)),auVar149);
                auVar149 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar107,
                                           ZEXT416(0x40000000));
                auVar149 = vfmadd231ss_fma(ZEXT416((uint)(fVar120 * fVar120 * -3.0)),
                                           ZEXT416((uint)(fVar120 + fVar120)),auVar149);
                auVar159 = vfnmadd231ss_fma(ZEXT416((uint)(fVar147 * (fVar120 + fVar120))),
                                            ZEXT416((uint)fVar120),ZEXT416((uint)fVar120));
                auVar128 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),auVar107,
                                           ZEXT416((uint)(fVar120 * -2.0)));
                fVar147 = auVar149._0_4_ * 0.5;
                fVar120 = auVar128._0_4_ * 0.5;
                auVar171._0_4_ = fVar120 * local_920;
                auVar171._4_4_ = fVar120 * fStack_91c;
                auVar171._8_4_ = fVar120 * fStack_918;
                auVar171._12_4_ = fVar120 * fStack_914;
                auVar154._4_4_ = fVar147;
                auVar154._0_4_ = fVar147;
                auVar154._8_4_ = fVar147;
                auVar154._12_4_ = fVar147;
                auVar149 = vfmadd132ps_fma(auVar154,auVar171,auVar15);
                fVar147 = auVar101._0_4_ * 0.5;
                auVar172._4_4_ = fVar147;
                auVar172._0_4_ = fVar147;
                auVar172._8_4_ = fVar147;
                auVar172._12_4_ = fVar147;
                auVar149 = vfmadd132ps_fma(auVar172,auVar149,auVar16);
                local_830.context = context->user;
                fVar147 = auVar159._0_4_ * 0.5;
                auVar155._4_4_ = fVar147;
                auVar155._0_4_ = fVar147;
                auVar155._8_4_ = fVar147;
                auVar155._12_4_ = fVar147;
                auVar101 = vfmadd132ps_fma(auVar155,auVar149,auVar105);
                local_240 = auVar101._0_4_;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                auVar149 = vmovshdup_avx(auVar101);
                local_220 = auVar149._0_8_;
                uStack_218 = local_220;
                uStack_210 = local_220;
                uStack_208 = local_220;
                auVar149 = vshufps_avx(auVar101,auVar101,0xaa);
                local_200 = auVar149._0_8_;
                uStack_1f8 = local_200;
                uStack_1f0 = local_200;
                uStack_1e8 = local_200;
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_1a0 = local_720._0_8_;
                uStack_198 = local_720._8_8_;
                uStack_190 = local_720._16_8_;
                uStack_188 = local_720._24_8_;
                uStack_8d0 = auVar89._16_8_;
                uStack_8c8 = auVar108._24_8_;
                local_180 = local_8e0;
                uStack_178 = uStack_8d8;
                uStack_170 = uStack_8d0;
                uStack_168 = uStack_8c8;
                local_7e8[1] = auVar166._0_32_;
                *local_7e8 = auVar166._0_32_;
                local_160 = (local_830.context)->instID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_140 = (local_830.context)->instPrimID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_6a0 = local_280;
                local_830.valid = (int *)local_6a0;
                local_830.geometryUserPtr = pGVar13->userPtr;
                local_830.hit = (RTCHitN *)&local_240;
                local_830.N = 8;
                local_830.ray = (RTCRayN *)ray;
                if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar220 = ZEXT1632(auVar166._0_16_);
                  (*pGVar13->intersectionFilterN)(&local_830);
                  auVar227 = ZEXT3264(_local_740);
                  auVar205 = ZEXT3264(local_7c0);
                  auVar221 = ZEXT3264(local_7a0);
                  auVar220 = vpcmpeqd_avx2(auVar220,auVar220);
                  auVar166 = ZEXT3264(auVar220);
                  auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                  context = local_7f8;
                  k = local_7f0;
                }
                auVar109 = vpcmpeqd_avx2(auVar146._0_32_,local_6a0);
                auVar220 = auVar166._0_32_ & ~auVar109;
                if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar220 >> 0x7f,0) == '\0') &&
                      (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar220 >> 0xbf,0) == '\0') &&
                    (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar220[0x1f]) {
                  auVar109 = auVar166._0_32_ ^ auVar109;
                }
                else {
                  p_Var14 = context->args->filter;
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar220 = ZEXT1632(auVar166._0_16_);
                    (*p_Var14)(&local_830);
                    auVar227 = ZEXT3264(_local_740);
                    auVar205 = ZEXT3264(local_7c0);
                    auVar221 = ZEXT3264(local_7a0);
                    auVar220 = vpcmpeqd_avx2(auVar220,auVar220);
                    auVar166 = ZEXT3264(auVar220);
                    auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                    context = local_7f8;
                    k = local_7f0;
                  }
                  auVar117 = vpcmpeqd_avx2(auVar146._0_32_,local_6a0);
                  auVar109 = auVar166._0_32_ ^ auVar117;
                  auVar220 = auVar166._0_32_ & ~auVar117;
                  if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar220 >> 0x7f,0) != '\0') ||
                        (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar220 >> 0xbf,0) != '\0') ||
                      (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar220[0x1f] < '\0') {
                    auVar144._0_4_ = auVar166._0_4_ ^ auVar117._0_4_;
                    auVar144._4_4_ = auVar166._4_4_ ^ auVar117._4_4_;
                    auVar144._8_4_ = auVar166._8_4_ ^ auVar117._8_4_;
                    auVar144._12_4_ = auVar166._12_4_ ^ auVar117._12_4_;
                    auVar144._16_4_ = auVar166._16_4_ ^ auVar117._16_4_;
                    auVar144._20_4_ = auVar166._20_4_ ^ auVar117._20_4_;
                    auVar144._24_4_ = auVar166._24_4_ ^ auVar117._24_4_;
                    auVar144._28_4_ = auVar166._28_4_ ^ auVar117._28_4_;
                    auVar220 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])local_830.hit);
                    *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_830.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_830.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_830.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_830.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])(local_830.hit + 0xa0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])(local_830.hit + 0xc0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])(local_830.hit + 0xe0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                         (local_830.hit + 0x100));
                    *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar220;
                  }
                }
                auVar220 = local_5e0;
                auVar193 = auVar221._0_32_;
                if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar109 >> 0x7f,0) == '\0') &&
                      (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar109 >> 0xbf,0) == '\0') &&
                    (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar109[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar96;
                }
                else {
                  uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
                }
                *(undefined4 *)(local_6c0 + uVar93 * 4) = 0;
                auVar119._4_4_ = uVar96;
                auVar119._0_4_ = uVar96;
                auVar119._8_4_ = uVar96;
                auVar119._12_4_ = uVar96;
                auVar119._16_4_ = uVar96;
                auVar119._20_4_ = uVar96;
                auVar119._24_4_ = uVar96;
                auVar119._28_4_ = uVar96;
                auVar117 = vcmpps_avx(auVar220,auVar119,2);
                auVar109 = vandps_avx(auVar117,local_6c0);
                local_6c0 = local_6c0 & auVar117;
                if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                      (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                    (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_6c0[0x1f]) break;
                auVar145._8_4_ = 0x7f800000;
                auVar145._0_8_ = 0x7f8000007f800000;
                auVar145._12_4_ = 0x7f800000;
                auVar145._16_4_ = 0x7f800000;
                auVar145._20_4_ = 0x7f800000;
                auVar145._24_4_ = 0x7f800000;
                auVar145._28_4_ = 0x7f800000;
                auVar220 = vblendvps_avx(auVar145,auVar220,auVar109);
                auVar117 = vshufps_avx(auVar220,auVar220,0xb1);
                auVar117 = vminps_avx(auVar220,auVar117);
                auVar135 = vshufpd_avx(auVar117,auVar117,5);
                auVar117 = vminps_avx(auVar117,auVar135);
                auVar135 = vpermpd_avx2(auVar117,0x4e);
                auVar117 = vminps_avx(auVar117,auVar135);
                auVar117 = vcmpps_avx(auVar220,auVar117,0);
                auVar135 = auVar109 & auVar117;
                auVar220 = auVar109;
                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar135 >> 0x7f,0) != '\0') ||
                      (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0xbf,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar135[0x1f] < '\0') {
                  auVar220 = vandps_avx(auVar117,auVar109);
                }
                uVar92 = vmovmskps_avx(auVar220);
                uVar8 = 0;
                for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                  uVar8 = uVar8 + 1;
                }
                uVar93 = (ulong)uVar8;
                local_6c0 = auVar109;
              }
              auVar231 = ZEXT3264(auVar205._0_32_);
            }
          }
          auVar146 = ZEXT3264(local_7e0);
          auVar166 = ZEXT3264(local_6e0);
          goto LAB_0117cfcf;
        }
      }
      auVar166 = ZEXT3264(local_6e0);
      auVar146 = ZEXT3264(local_7e0);
      auVar231 = ZEXT3264(local_7c0);
    }
LAB_0117cfcf:
    auVar221 = ZEXT3264(local_620);
    auVar205 = ZEXT3264(CONCAT428(fStack_4e4,
                                  CONCAT424(fStack_4e8,
                                            CONCAT420(fStack_4ec,
                                                      CONCAT416(fStack_4f0,
                                                                CONCAT412(fStack_4f4,
                                                                          CONCAT48(fStack_4f8,
                                                                                   CONCAT44(
                                                  fStack_4fc,local_500))))))));
    if (8 < iVar90) {
      local_7c0 = auVar231._0_32_;
      local_440._4_4_ = iVar90;
      local_440._0_4_ = iVar90;
      local_440._8_4_ = iVar90;
      local_440._12_4_ = iVar90;
      local_440._16_4_ = iVar90;
      local_440._20_4_ = iVar90;
      local_440._24_4_ = iVar90;
      local_440._28_4_ = iVar90;
      local_4a0._4_4_ = fVar148;
      local_4a0._0_4_ = fVar148;
      fStack_498 = fVar148;
      fStack_494 = fVar148;
      fStack_490 = fVar148;
      fStack_48c = fVar148;
      fStack_488 = fVar148;
      fStack_484 = fVar148;
      local_100 = local_780._0_4_;
      uStack_fc = local_780._0_4_;
      uStack_f8 = local_780._0_4_;
      uStack_f4 = local_780._0_4_;
      uStack_f0 = local_780._0_4_;
      uStack_ec = local_780._0_4_;
      uStack_e8 = local_780._0_4_;
      uStack_e4 = local_780._0_4_;
      local_120 = 1.0 / (float)local_540._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_540._4_4_ = local_640._0_4_;
      local_540._0_4_ = local_640._0_4_;
      uStack_538._0_4_ = local_640._0_4_;
      uStack_538._4_4_ = local_640._0_4_;
      uStack_530 = local_640._0_4_;
      uStack_52c = local_640._0_4_;
      uStack_528 = local_640._0_4_;
      uStack_524 = local_640._0_4_;
      local_560._4_4_ = local_560._0_4_;
      local_560._8_4_ = local_560._0_4_;
      local_560._12_4_ = local_560._0_4_;
      uStack_550 = local_560._0_4_;
      uStack_54c = local_560._0_4_;
      uStack_548 = local_560._0_4_;
      uStack_544 = local_560._0_4_;
      _local_740 = auVar227._0_32_;
      fVar148 = (float)local_760;
      fVar147 = local_760._4_4_;
      fVar120 = (float)uStack_758;
      fVar121 = uStack_758._4_4_;
      fVar122 = (float)uStack_750;
      fVar123 = uStack_750._4_4_;
      fVar124 = (float)uStack_748;
      uVar96 = uStack_748._4_4_;
      local_7a0 = auVar193;
      for (lVar98 = 8; local_7e0 = auVar146._0_32_, lVar98 < iVar90; lVar98 = lVar98 + 8) {
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar98 * 4 + lVar94);
        auVar220 = *(undefined1 (*) [32])(lVar94 + 0x22047f0 + lVar98 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar94 + 0x2204c74 + lVar98 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar94 + 0x22050f8 + lVar98 * 4);
        fVar125 = *(float *)*pauVar5;
        fVar195 = *(float *)(*pauVar5 + 4);
        fVar196 = *(float *)(*pauVar5 + 8);
        fVar197 = *(float *)(*pauVar5 + 0xc);
        fVar210 = *(float *)(*pauVar5 + 0x10);
        fVar212 = *(float *)(*pauVar5 + 0x14);
        fVar214 = *(float *)(*pauVar5 + 0x18);
        auVar87 = *(undefined1 (*) [28])*pauVar5;
        fVar198 = auVar205._0_4_;
        auVar228._0_4_ = fVar198 * fVar125;
        fVar206 = auVar205._4_4_;
        auVar228._4_4_ = fVar206 * fVar195;
        fVar207 = auVar205._8_4_;
        auVar228._8_4_ = fVar207 * fVar196;
        fVar208 = auVar205._12_4_;
        auVar228._12_4_ = fVar208 * fVar197;
        fVar209 = auVar205._16_4_;
        auVar228._16_4_ = fVar209 * fVar210;
        fVar211 = auVar205._20_4_;
        auVar228._20_4_ = fVar211 * fVar212;
        fVar213 = auVar205._24_4_;
        auVar228._28_36_ = auVar227._28_36_;
        auVar228._24_4_ = fVar213 * fVar214;
        auVar227._0_4_ = fVar125 * fVar148;
        auVar227._4_4_ = fVar195 * fVar147;
        auVar227._8_4_ = fVar196 * fVar120;
        auVar227._12_4_ = fVar197 * fVar121;
        auVar227._16_4_ = fVar210 * fVar122;
        auVar227._20_4_ = fVar212 * fVar123;
        auVar227._28_36_ = auVar231._28_36_;
        auVar227._24_4_ = fVar214 * fVar124;
        auVar15 = vfmadd231ps_fma(auVar228._0_32_,auVar109,auVar166._0_32_);
        auVar219 = auVar221._0_32_;
        auVar16 = vfmadd231ps_fma(auVar227._0_32_,auVar109,auVar219);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar220,auVar242);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar220,local_5a0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar108,auVar236);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar108,local_580);
        auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar98 * 4 + lVar94);
        auVar135 = *(undefined1 (*) [32])(lVar94 + 0x2206c10 + lVar98 * 4);
        auVar204 = *(undefined1 (*) [32])(lVar94 + 0x2207094 + lVar98 * 4);
        pfVar7 = (float *)(lVar94 + 0x2207518 + lVar98 * 4);
        fVar74 = *pfVar7;
        fVar229 = pfVar7[1];
        fVar232 = pfVar7[2];
        fVar233 = pfVar7[3];
        fVar239 = pfVar7[4];
        fVar240 = pfVar7[5];
        fVar241 = pfVar7[6];
        auVar41._4_4_ = fVar206 * fVar229;
        auVar41._0_4_ = fVar198 * fVar74;
        auVar41._8_4_ = fVar207 * fVar232;
        auVar41._12_4_ = fVar208 * fVar233;
        auVar41._16_4_ = fVar209 * fVar239;
        auVar41._20_4_ = fVar211 * fVar240;
        auVar41._24_4_ = fVar213 * fVar241;
        auVar41._28_4_ = auVar108._28_4_;
        auVar42._4_4_ = fVar147 * fVar229;
        auVar42._0_4_ = fVar148 * fVar74;
        auVar42._8_4_ = fVar120 * fVar232;
        auVar42._12_4_ = fVar121 * fVar233;
        auVar42._16_4_ = fVar122 * fVar239;
        auVar42._20_4_ = fVar123 * fVar240;
        auVar42._24_4_ = fVar124 * fVar241;
        auVar42._28_4_ = uVar96;
        auVar105 = vfmadd231ps_fma(auVar41,auVar204,auVar166._0_32_);
        auVar149 = vfmadd231ps_fma(auVar42,auVar204,auVar219);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar135,auVar242);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar135,local_5a0);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar117,auVar236);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar117,local_580);
        local_780 = ZEXT1632(auVar105);
        local_720 = ZEXT1632(auVar15);
        local_400 = vsubps_avx(local_780,local_720);
        auVar138 = ZEXT1632(auVar149);
        local_640 = ZEXT1632(auVar16);
        local_420 = vsubps_avx(auVar138,local_640);
        auVar43._4_4_ = auVar16._4_4_ * local_400._4_4_;
        auVar43._0_4_ = auVar16._0_4_ * local_400._0_4_;
        auVar43._8_4_ = auVar16._8_4_ * local_400._8_4_;
        auVar43._12_4_ = auVar16._12_4_ * local_400._12_4_;
        auVar43._16_4_ = local_400._16_4_ * 0.0;
        auVar43._20_4_ = local_400._20_4_ * 0.0;
        auVar43._24_4_ = local_400._24_4_ * 0.0;
        auVar43._28_4_ = local_580._28_4_;
        fVar148 = local_420._0_4_;
        auVar139._0_4_ = auVar15._0_4_ * fVar148;
        fVar147 = local_420._4_4_;
        auVar139._4_4_ = auVar15._4_4_ * fVar147;
        fVar120 = local_420._8_4_;
        auVar139._8_4_ = auVar15._8_4_ * fVar120;
        fVar121 = local_420._12_4_;
        auVar139._12_4_ = auVar15._12_4_ * fVar121;
        fVar122 = local_420._16_4_;
        auVar139._16_4_ = fVar122 * 0.0;
        fVar123 = local_420._20_4_;
        auVar139._20_4_ = fVar123 * 0.0;
        fVar124 = local_420._24_4_;
        auVar139._24_4_ = fVar124 * 0.0;
        auVar139._28_4_ = 0;
        auVar227 = ZEXT3264(auVar109);
        auVar111 = vsubps_avx(auVar43,auVar139);
        auVar44._4_4_ = local_e0._4_4_ * fVar195;
        auVar44._0_4_ = (float)local_e0 * fVar125;
        auVar44._8_4_ = (float)uStack_d8 * fVar196;
        auVar44._12_4_ = uStack_d8._4_4_ * fVar197;
        auVar44._16_4_ = (float)uStack_d0 * fVar210;
        auVar44._20_4_ = uStack_d0._4_4_ * fVar212;
        auVar44._24_4_ = (float)uStack_c8 * fVar214;
        auVar44._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar44,auVar109,local_c0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_a0,auVar220);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_80,auVar108);
        auVar45._4_4_ = local_e0._4_4_ * fVar229;
        auVar45._0_4_ = (float)local_e0 * fVar74;
        auVar45._8_4_ = (float)uStack_d8 * fVar232;
        auVar45._12_4_ = uStack_d8._4_4_ * fVar233;
        auVar45._16_4_ = (float)uStack_d0 * fVar239;
        auVar45._20_4_ = uStack_d0._4_4_ * fVar240;
        auVar45._24_4_ = (float)uStack_c8 * fVar241;
        auVar45._28_4_ = uStack_c8._4_4_;
        auVar16 = vfmadd231ps_fma(auVar45,auVar204,local_c0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar135,local_a0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar117,local_80);
        auVar231 = ZEXT1664(auVar16);
        auVar146._0_4_ = fVar148 * fVar148;
        auVar146._4_4_ = fVar147 * fVar147;
        auVar146._8_4_ = fVar120 * fVar120;
        auVar146._12_4_ = fVar121 * fVar121;
        auVar146._16_4_ = fVar122 * fVar122;
        auVar146._20_4_ = fVar123 * fVar123;
        auVar146._28_36_ = auVar205._28_36_;
        auVar146._24_4_ = fVar124 * fVar124;
        auVar105 = vfmadd231ps_fma(auVar146._0_32_,local_400,local_400);
        _local_520 = ZEXT1632(auVar15);
        auVar230 = ZEXT1632(auVar16);
        auVar175 = vmaxps_avx(_local_520,auVar230);
        auVar201._0_4_ = auVar175._0_4_ * auVar175._0_4_ * auVar105._0_4_;
        auVar201._4_4_ = auVar175._4_4_ * auVar175._4_4_ * auVar105._4_4_;
        auVar201._8_4_ = auVar175._8_4_ * auVar175._8_4_ * auVar105._8_4_;
        auVar201._12_4_ = auVar175._12_4_ * auVar175._12_4_ * auVar105._12_4_;
        auVar201._16_4_ = auVar175._16_4_ * auVar175._16_4_ * 0.0;
        auVar201._20_4_ = auVar175._20_4_ * auVar175._20_4_ * 0.0;
        auVar201._24_4_ = auVar175._24_4_ * auVar175._24_4_ * 0.0;
        auVar201._28_4_ = 0;
        auVar46._4_4_ = auVar111._4_4_ * auVar111._4_4_;
        auVar46._0_4_ = auVar111._0_4_ * auVar111._0_4_;
        auVar46._8_4_ = auVar111._8_4_ * auVar111._8_4_;
        auVar46._12_4_ = auVar111._12_4_ * auVar111._12_4_;
        auVar46._16_4_ = auVar111._16_4_ * auVar111._16_4_;
        auVar46._20_4_ = auVar111._20_4_ * auVar111._20_4_;
        auVar46._24_4_ = auVar111._24_4_ * auVar111._24_4_;
        auVar46._28_4_ = auVar111._28_4_;
        auVar175 = vcmpps_avx(auVar46,auVar201,2);
        local_360 = (int)lVar98;
        auVar202._4_4_ = local_360;
        auVar202._0_4_ = local_360;
        auVar202._8_4_ = local_360;
        auVar202._12_4_ = local_360;
        auVar202._16_4_ = local_360;
        auVar202._20_4_ = local_360;
        auVar202._24_4_ = local_360;
        auVar202._28_4_ = local_360;
        auVar111 = vpor_avx2(auVar202,_DAT_01fb4ba0);
        auVar20 = vpcmpgtd_avx2(local_440,auVar111);
        auVar111 = auVar20 & auVar175;
        fVar148 = (float)local_760;
        fVar147 = local_760._4_4_;
        fVar120 = (float)uStack_758;
        fVar121 = uStack_758._4_4_;
        fVar122 = (float)uStack_750;
        fVar123 = uStack_750._4_4_;
        fVar124 = (float)uStack_748;
        uVar96 = uStack_748._4_4_;
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0x7f,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar111 >> 0xbf,0) == '\0') &&
            (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar111[0x1f]) {
          auVar146 = ZEXT3264(local_7e0);
          auVar221 = ZEXT3264(auVar219);
          auVar205 = ZEXT3264(auVar205._0_32_);
        }
        else {
          local_460 = vandps_avx(auVar20,auVar175);
          auVar47._4_4_ = (float)local_740._4_4_ * fVar229;
          auVar47._0_4_ = (float)local_740._0_4_ * fVar74;
          auVar47._8_4_ = fStack_738 * fVar232;
          auVar47._12_4_ = fStack_734 * fVar233;
          auVar47._16_4_ = fStack_730 * fVar239;
          auVar47._20_4_ = fStack_72c * fVar240;
          auVar47._24_4_ = fStack_728 * fVar241;
          auVar47._28_4_ = auVar175._28_4_;
          auVar15 = vfmadd213ps_fma(auVar204,local_7c0,auVar47);
          auVar15 = vfmadd213ps_fma(auVar135,local_7a0,ZEXT1632(auVar15));
          auVar15 = vfmadd132ps_fma(auVar117,ZEXT1632(auVar15),local_700);
          _local_480 = ZEXT1632(auVar15);
          local_5c0._0_4_ = auVar87._0_4_;
          local_5c0._4_4_ = auVar87._4_4_;
          fStack_5b8 = auVar87._8_4_;
          fStack_5b4 = auVar87._12_4_;
          fStack_5b0 = auVar87._16_4_;
          fStack_5ac = auVar87._20_4_;
          fStack_5a8 = auVar87._24_4_;
          auVar48._4_4_ = (float)local_740._4_4_ * (float)local_5c0._4_4_;
          auVar48._0_4_ = (float)local_740._0_4_ * (float)local_5c0._0_4_;
          auVar48._8_4_ = fStack_738 * fStack_5b8;
          auVar48._12_4_ = fStack_734 * fStack_5b4;
          auVar48._16_4_ = fStack_730 * fStack_5b0;
          auVar48._20_4_ = fStack_72c * fStack_5ac;
          auVar48._24_4_ = fStack_728 * fStack_5a8;
          auVar48._28_4_ = auVar175._28_4_;
          auVar15 = vfmadd213ps_fma(auVar109,local_7c0,auVar48);
          auVar15 = vfmadd213ps_fma(auVar220,local_7a0,ZEXT1632(auVar15));
          auVar220 = *(undefined1 (*) [32])(lVar94 + 0x220557c + lVar98 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar94 + 0x2205a00 + lVar98 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar94 + 0x2205e84 + lVar98 * 4);
          pfVar7 = (float *)(lVar94 + 0x2206308 + lVar98 * 4);
          fVar125 = *pfVar7;
          fVar195 = pfVar7[1];
          fVar196 = pfVar7[2];
          fVar197 = pfVar7[3];
          fVar210 = pfVar7[4];
          fVar212 = pfVar7[5];
          fVar214 = pfVar7[6];
          auVar49._4_4_ = fVar206 * fVar195;
          auVar49._0_4_ = fVar198 * fVar125;
          auVar49._8_4_ = fVar207 * fVar196;
          auVar49._12_4_ = fVar208 * fVar197;
          auVar49._16_4_ = fVar209 * fVar210;
          auVar49._20_4_ = fVar211 * fVar212;
          auVar49._24_4_ = fVar213 * fVar214;
          auVar49._28_4_ = uStack_724;
          auVar225._0_4_ = fVar125 * (float)local_760;
          auVar225._4_4_ = fVar195 * local_760._4_4_;
          auVar225._8_4_ = fVar196 * (float)uStack_758;
          auVar225._12_4_ = fVar197 * uStack_758._4_4_;
          auVar225._16_4_ = fVar210 * (float)uStack_750;
          auVar225._20_4_ = fVar212 * uStack_750._4_4_;
          auVar225._24_4_ = fVar214 * (float)uStack_748;
          auVar225._28_4_ = 0;
          auVar50._4_4_ = fVar195 * (float)local_740._4_4_;
          auVar50._0_4_ = fVar125 * (float)local_740._0_4_;
          auVar50._8_4_ = fVar196 * fStack_738;
          auVar50._12_4_ = fVar197 * fStack_734;
          auVar50._16_4_ = fVar210 * fStack_730;
          auVar50._20_4_ = fVar212 * fStack_72c;
          auVar50._24_4_ = fVar214 * fStack_728;
          auVar50._28_4_ = pfVar7[7];
          auVar16 = vfmadd231ps_fma(auVar49,auVar117,local_6e0);
          auVar105 = vfmadd231ps_fma(auVar225,auVar117,auVar219);
          auVar149 = vfmadd231ps_fma(auVar50,local_7c0,auVar117);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar109,auVar242);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar109,local_5a0);
          auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),local_7a0,auVar109);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar220,auVar236);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar220,local_580);
          auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar220,local_700);
          pfVar7 = (float *)(lVar94 + 0x2208728 + lVar98 * 4);
          fVar125 = *pfVar7;
          fVar195 = pfVar7[1];
          fVar196 = pfVar7[2];
          fVar197 = pfVar7[3];
          fVar210 = pfVar7[4];
          fVar212 = pfVar7[5];
          fVar214 = pfVar7[6];
          auVar51._4_4_ = fVar206 * fVar195;
          auVar51._0_4_ = fVar198 * fVar125;
          auVar51._8_4_ = fVar207 * fVar196;
          auVar51._12_4_ = fVar208 * fVar197;
          auVar51._16_4_ = fVar209 * fVar210;
          auVar51._20_4_ = fVar211 * fVar212;
          auVar51._24_4_ = fVar213 * fVar214;
          auVar51._28_4_ = auVar221._28_4_;
          auVar52._4_4_ = local_760._4_4_ * fVar195;
          auVar52._0_4_ = (float)local_760 * fVar125;
          auVar52._8_4_ = (float)uStack_758 * fVar196;
          auVar52._12_4_ = uStack_758._4_4_ * fVar197;
          auVar52._16_4_ = (float)uStack_750 * fVar210;
          auVar52._20_4_ = uStack_750._4_4_ * fVar212;
          auVar52._24_4_ = (float)uStack_748 * fVar214;
          auVar52._28_4_ = local_420._28_4_;
          auVar53._4_4_ = (float)local_740._4_4_ * fVar195;
          auVar53._0_4_ = (float)local_740._0_4_ * fVar125;
          auVar53._8_4_ = fStack_738 * fVar196;
          auVar53._12_4_ = fStack_734 * fVar197;
          auVar53._16_4_ = fStack_730 * fVar210;
          auVar53._20_4_ = fStack_72c * fVar212;
          auVar53._24_4_ = fStack_728 * fVar214;
          auVar53._28_4_ = pfVar7[7];
          auVar220 = *(undefined1 (*) [32])(lVar94 + 0x22082a4 + lVar98 * 4);
          auVar101 = vfmadd231ps_fma(auVar51,auVar220,local_6e0);
          auVar128 = vfmadd231ps_fma(auVar52,auVar220,auVar219);
          auVar159 = vfmadd231ps_fma(auVar53,auVar220,local_7c0);
          auVar220 = *(undefined1 (*) [32])(lVar94 + 0x2207e20 + lVar98 * 4);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar220,auVar242);
          auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar220,local_5a0);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar220,local_7a0);
          auVar220 = *(undefined1 (*) [32])(lVar94 + 0x220799c + lVar98 * 4);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar220,auVar236);
          auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar220,local_580);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),local_700,auVar220);
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar203._16_4_ = 0x7fffffff;
          auVar203._20_4_ = 0x7fffffff;
          auVar203._24_4_ = 0x7fffffff;
          auVar203._28_4_ = 0x7fffffff;
          auVar220 = vandps_avx(ZEXT1632(auVar16),auVar203);
          auVar109 = vandps_avx(ZEXT1632(auVar105),auVar203);
          auVar109 = vmaxps_avx(auVar220,auVar109);
          auVar220 = vandps_avx(ZEXT1632(auVar149),auVar203);
          auVar220 = vmaxps_avx(auVar109,auVar220);
          auVar220 = vcmpps_avx(auVar220,_local_4a0,1);
          auVar117 = vblendvps_avx(ZEXT1632(auVar16),local_400,auVar220);
          auVar135 = vblendvps_avx(ZEXT1632(auVar105),local_420,auVar220);
          auVar220 = vandps_avx(ZEXT1632(auVar101),auVar203);
          auVar109 = vandps_avx(ZEXT1632(auVar128),auVar203);
          auVar109 = vmaxps_avx(auVar220,auVar109);
          auVar220 = vandps_avx(auVar203,ZEXT1632(auVar159));
          auVar220 = vmaxps_avx(auVar109,auVar220);
          auVar109 = vcmpps_avx(auVar220,_local_4a0,1);
          auVar220 = vblendvps_avx(ZEXT1632(auVar101),local_400,auVar109);
          auVar109 = vblendvps_avx(ZEXT1632(auVar128),local_420,auVar109);
          auVar15 = vfmadd213ps_fma(auVar108,local_700,ZEXT1632(auVar15));
          auVar16 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar135,auVar135);
          auVar108 = vrsqrtps_avx(ZEXT1632(auVar16));
          fVar125 = auVar108._0_4_;
          fVar195 = auVar108._4_4_;
          fVar196 = auVar108._8_4_;
          fVar197 = auVar108._12_4_;
          fVar210 = auVar108._16_4_;
          fVar212 = auVar108._20_4_;
          fVar214 = auVar108._24_4_;
          auVar54._4_4_ = fVar195 * fVar195 * fVar195 * auVar16._4_4_ * -0.5;
          auVar54._0_4_ = fVar125 * fVar125 * fVar125 * auVar16._0_4_ * -0.5;
          auVar54._8_4_ = fVar196 * fVar196 * fVar196 * auVar16._8_4_ * -0.5;
          auVar54._12_4_ = fVar197 * fVar197 * fVar197 * auVar16._12_4_ * -0.5;
          auVar54._16_4_ = fVar210 * fVar210 * fVar210 * -0.0;
          auVar54._20_4_ = fVar212 * fVar212 * fVar212 * -0.0;
          auVar54._24_4_ = fVar214 * fVar214 * fVar214 * -0.0;
          auVar54._28_4_ = 0;
          auVar238._8_4_ = 0x3fc00000;
          auVar238._0_8_ = 0x3fc000003fc00000;
          auVar238._12_4_ = 0x3fc00000;
          auVar238._16_4_ = 0x3fc00000;
          auVar238._20_4_ = 0x3fc00000;
          auVar238._24_4_ = 0x3fc00000;
          auVar238._28_4_ = 0x3fc00000;
          auVar16 = vfmadd231ps_fma(auVar54,auVar238,auVar108);
          fVar125 = auVar16._0_4_;
          fVar195 = auVar16._4_4_;
          auVar55._4_4_ = auVar135._4_4_ * fVar195;
          auVar55._0_4_ = auVar135._0_4_ * fVar125;
          fVar196 = auVar16._8_4_;
          auVar55._8_4_ = auVar135._8_4_ * fVar196;
          fVar197 = auVar16._12_4_;
          auVar55._12_4_ = auVar135._12_4_ * fVar197;
          auVar55._16_4_ = auVar135._16_4_ * 0.0;
          auVar55._20_4_ = auVar135._20_4_ * 0.0;
          auVar55._24_4_ = auVar135._24_4_ * 0.0;
          auVar55._28_4_ = auVar108._28_4_;
          auVar56._4_4_ = fVar195 * -auVar117._4_4_;
          auVar56._0_4_ = fVar125 * -auVar117._0_4_;
          auVar56._8_4_ = fVar196 * -auVar117._8_4_;
          auVar56._12_4_ = fVar197 * -auVar117._12_4_;
          auVar56._16_4_ = -auVar117._16_4_ * 0.0;
          auVar56._20_4_ = -auVar117._20_4_ * 0.0;
          auVar56._24_4_ = -auVar117._24_4_ * 0.0;
          auVar56._28_4_ = auVar135._28_4_;
          auVar16 = vfmadd213ps_fma(auVar220,auVar220,ZEXT832(0) << 0x20);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar109,auVar109);
          auVar108 = vrsqrtps_avx(ZEXT1632(auVar16));
          auVar57._28_4_ = local_420._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar197 * 0.0,
                                  CONCAT48(fVar196 * 0.0,CONCAT44(fVar195 * 0.0,fVar125 * 0.0))));
          fVar125 = auVar108._0_4_;
          fVar195 = auVar108._4_4_;
          fVar196 = auVar108._8_4_;
          fVar197 = auVar108._12_4_;
          fVar210 = auVar108._16_4_;
          fVar212 = auVar108._20_4_;
          fVar214 = auVar108._24_4_;
          auVar58._4_4_ = fVar195 * fVar195 * fVar195 * auVar16._4_4_ * -0.5;
          auVar58._0_4_ = fVar125 * fVar125 * fVar125 * auVar16._0_4_ * -0.5;
          auVar58._8_4_ = fVar196 * fVar196 * fVar196 * auVar16._8_4_ * -0.5;
          auVar58._12_4_ = fVar197 * fVar197 * fVar197 * auVar16._12_4_ * -0.5;
          auVar58._16_4_ = fVar210 * fVar210 * fVar210 * -0.0;
          auVar58._20_4_ = fVar212 * fVar212 * fVar212 * -0.0;
          auVar58._24_4_ = fVar214 * fVar214 * fVar214 * -0.0;
          auVar58._28_4_ = 0;
          auVar16 = vfmadd231ps_fma(auVar58,auVar238,auVar108);
          fVar125 = auVar16._0_4_;
          fVar195 = auVar16._4_4_;
          auVar59._4_4_ = auVar109._4_4_ * fVar195;
          auVar59._0_4_ = auVar109._0_4_ * fVar125;
          fVar196 = auVar16._8_4_;
          auVar59._8_4_ = auVar109._8_4_ * fVar196;
          fVar197 = auVar16._12_4_;
          auVar59._12_4_ = auVar109._12_4_ * fVar197;
          auVar59._16_4_ = auVar109._16_4_ * 0.0;
          auVar59._20_4_ = auVar109._20_4_ * 0.0;
          auVar59._24_4_ = auVar109._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar60._4_4_ = fVar195 * -auVar220._4_4_;
          auVar60._0_4_ = fVar125 * -auVar220._0_4_;
          auVar60._8_4_ = fVar196 * -auVar220._8_4_;
          auVar60._12_4_ = fVar197 * -auVar220._12_4_;
          auVar60._16_4_ = -auVar220._16_4_ * 0.0;
          auVar60._20_4_ = -auVar220._20_4_ * 0.0;
          auVar60._24_4_ = -auVar220._24_4_ * 0.0;
          auVar60._28_4_ = auVar108._28_4_;
          auVar61._28_4_ = 0xbf000000;
          auVar61._0_28_ =
               ZEXT1628(CONCAT412(fVar197 * 0.0,
                                  CONCAT48(fVar196 * 0.0,CONCAT44(fVar195 * 0.0,fVar125 * 0.0))));
          auVar16 = vfmadd213ps_fma(auVar55,_local_520,local_720);
          auVar105 = vfmadd213ps_fma(auVar56,_local_520,local_640);
          auVar149 = vfmadd213ps_fma(auVar57,_local_520,ZEXT1632(auVar15));
          auVar100 = vfnmadd213ps_fma(auVar55,_local_520,local_720);
          auVar101 = vfmadd213ps_fma(auVar59,auVar230,local_780);
          auVar126 = vfnmadd213ps_fma(auVar56,_local_520,local_640);
          auVar128 = vfmadd213ps_fma(auVar60,auVar230,auVar138);
          auVar15 = vfnmadd231ps_fma(ZEXT1632(auVar15),_local_520,auVar57);
          auVar159 = vfmadd213ps_fma(auVar61,auVar230,_local_480);
          auVar174 = vfnmadd213ps_fma(auVar59,auVar230,local_780);
          auVar179 = vfnmadd213ps_fma(auVar60,auVar230,auVar138);
          auVar180 = vfnmadd231ps_fma(_local_480,auVar230,auVar61);
          auVar108 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar126));
          auVar220 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar15));
          auVar62._4_4_ = auVar108._4_4_ * auVar15._4_4_;
          auVar62._0_4_ = auVar108._0_4_ * auVar15._0_4_;
          auVar62._8_4_ = auVar108._8_4_ * auVar15._8_4_;
          auVar62._12_4_ = auVar108._12_4_ * auVar15._12_4_;
          auVar62._16_4_ = auVar108._16_4_ * 0.0;
          auVar62._20_4_ = auVar108._20_4_ * 0.0;
          auVar62._24_4_ = auVar108._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar167 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar126),auVar220);
          auVar63._4_4_ = auVar100._4_4_ * auVar220._4_4_;
          auVar63._0_4_ = auVar100._0_4_ * auVar220._0_4_;
          auVar63._8_4_ = auVar100._8_4_ * auVar220._8_4_;
          auVar63._12_4_ = auVar100._12_4_ * auVar220._12_4_;
          auVar63._16_4_ = auVar220._16_4_ * 0.0;
          auVar63._20_4_ = auVar220._20_4_ * 0.0;
          auVar63._24_4_ = auVar220._24_4_ * 0.0;
          auVar63._28_4_ = auVar220._28_4_;
          auVar204 = ZEXT1632(auVar100);
          auVar220 = vsubps_avx(ZEXT1632(auVar101),auVar204);
          auVar111 = ZEXT1632(auVar15);
          auVar15 = vfmsub231ps_fma(auVar63,auVar111,auVar220);
          auVar64._4_4_ = auVar126._4_4_ * auVar220._4_4_;
          auVar64._0_4_ = auVar126._0_4_ * auVar220._0_4_;
          auVar64._8_4_ = auVar126._8_4_ * auVar220._8_4_;
          auVar64._12_4_ = auVar126._12_4_ * auVar220._12_4_;
          auVar64._16_4_ = auVar220._16_4_ * 0.0;
          auVar64._20_4_ = auVar220._20_4_ * 0.0;
          auVar64._24_4_ = auVar220._24_4_ * 0.0;
          auVar64._28_4_ = auVar220._28_4_;
          auVar100 = vfmsub231ps_fma(auVar64,auVar204,auVar108);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar167));
          auVar20 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,2);
          auVar108 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar16),auVar20);
          auVar220 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar105),auVar20);
          local_780 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar149),auVar20);
          auVar109 = vblendvps_avx(auVar204,ZEXT1632(auVar101),auVar20);
          auVar117 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar128),auVar20);
          auVar135 = vblendvps_avx(auVar111,ZEXT1632(auVar159),auVar20);
          auVar204 = vblendvps_avx(ZEXT1632(auVar101),auVar204,auVar20);
          auVar175 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar126),auVar20);
          auVar15 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
          auVar111 = vblendvps_avx(ZEXT1632(auVar159),auVar111,auVar20);
          auVar204 = vsubps_avx(auVar204,auVar108);
          auVar175 = vsubps_avx(auVar175,auVar220);
          auVar138 = vsubps_avx(auVar111,local_780);
          auVar227 = ZEXT3264(auVar138);
          auVar219 = vsubps_avx(auVar108,auVar109);
          auVar110 = vsubps_avx(auVar220,auVar117);
          auVar112 = vsubps_avx(local_780,auVar135);
          auVar231 = ZEXT3264(auVar112);
          auVar176._0_4_ = auVar138._0_4_ * auVar108._0_4_;
          auVar176._4_4_ = auVar138._4_4_ * auVar108._4_4_;
          auVar176._8_4_ = auVar138._8_4_ * auVar108._8_4_;
          auVar176._12_4_ = auVar138._12_4_ * auVar108._12_4_;
          auVar176._16_4_ = auVar138._16_4_ * auVar108._16_4_;
          auVar176._20_4_ = auVar138._20_4_ * auVar108._20_4_;
          auVar176._24_4_ = auVar138._24_4_ * auVar108._24_4_;
          auVar176._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar176,local_780,auVar204);
          auVar65._4_4_ = auVar204._4_4_ * auVar220._4_4_;
          auVar65._0_4_ = auVar204._0_4_ * auVar220._0_4_;
          auVar65._8_4_ = auVar204._8_4_ * auVar220._8_4_;
          auVar65._12_4_ = auVar204._12_4_ * auVar220._12_4_;
          auVar65._16_4_ = auVar204._16_4_ * auVar220._16_4_;
          auVar65._20_4_ = auVar204._20_4_ * auVar220._20_4_;
          auVar65._24_4_ = auVar204._24_4_ * auVar220._24_4_;
          auVar65._28_4_ = auVar111._28_4_;
          auVar105 = vfmsub231ps_fma(auVar65,auVar108,auVar175);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar177._0_4_ = auVar175._0_4_ * local_780._0_4_;
          auVar177._4_4_ = auVar175._4_4_ * local_780._4_4_;
          auVar177._8_4_ = auVar175._8_4_ * local_780._8_4_;
          auVar177._12_4_ = auVar175._12_4_ * local_780._12_4_;
          auVar177._16_4_ = auVar175._16_4_ * local_780._16_4_;
          auVar177._20_4_ = auVar175._20_4_ * local_780._20_4_;
          auVar177._24_4_ = auVar175._24_4_ * local_780._24_4_;
          auVar177._28_4_ = 0;
          auVar105 = vfmsub231ps_fma(auVar177,auVar220,auVar138);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
          auVar178._0_4_ = auVar112._0_4_ * auVar109._0_4_;
          auVar178._4_4_ = auVar112._4_4_ * auVar109._4_4_;
          auVar178._8_4_ = auVar112._8_4_ * auVar109._8_4_;
          auVar178._12_4_ = auVar112._12_4_ * auVar109._12_4_;
          auVar178._16_4_ = auVar112._16_4_ * auVar109._16_4_;
          auVar178._20_4_ = auVar112._20_4_ * auVar109._20_4_;
          auVar178._24_4_ = auVar112._24_4_ * auVar109._24_4_;
          auVar178._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar178,auVar219,auVar135);
          auVar66._4_4_ = auVar110._4_4_ * auVar135._4_4_;
          auVar66._0_4_ = auVar110._0_4_ * auVar135._0_4_;
          auVar66._8_4_ = auVar110._8_4_ * auVar135._8_4_;
          auVar66._12_4_ = auVar110._12_4_ * auVar135._12_4_;
          auVar66._16_4_ = auVar110._16_4_ * auVar135._16_4_;
          auVar66._20_4_ = auVar110._20_4_ * auVar135._20_4_;
          auVar66._24_4_ = auVar110._24_4_ * auVar135._24_4_;
          auVar66._28_4_ = auVar108._28_4_;
          auVar149 = vfmsub231ps_fma(auVar66,auVar117,auVar112);
          auVar67._4_4_ = auVar219._4_4_ * auVar117._4_4_;
          auVar67._0_4_ = auVar219._0_4_ * auVar117._0_4_;
          auVar67._8_4_ = auVar219._8_4_ * auVar117._8_4_;
          auVar67._12_4_ = auVar219._12_4_ * auVar117._12_4_;
          auVar67._16_4_ = auVar219._16_4_ * auVar117._16_4_;
          auVar67._20_4_ = auVar219._20_4_ * auVar117._20_4_;
          auVar67._24_4_ = auVar219._24_4_ * auVar117._24_4_;
          auVar67._28_4_ = auVar117._28_4_;
          auVar101 = vfmsub231ps_fma(auVar67,auVar110,auVar109);
          auVar117 = ZEXT832(0) << 0x20;
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar117,ZEXT1632(auVar16));
          auVar149 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar117,ZEXT1632(auVar149));
          auVar109 = vmaxps_avx(ZEXT1632(auVar105),ZEXT1632(auVar149));
          auVar109 = vcmpps_avx(auVar109,auVar117,2);
          auVar16 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
          auVar15 = vpand_avx(auVar16,auVar15);
          auVar109 = vpmovsxwd_avx2(auVar15);
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar109 >> 0x7f,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar109 >> 0xbf,0) == '\0') &&
              (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar109[0x1f]) {
LAB_0117df04:
            auVar165._8_8_ = uStack_658;
            auVar165._0_8_ = local_660;
            auVar165._16_8_ = uStack_650;
            auVar165._24_8_ = uStack_648;
          }
          else {
            auVar68._4_4_ = auVar175._4_4_ * auVar112._4_4_;
            auVar68._0_4_ = auVar175._0_4_ * auVar112._0_4_;
            auVar68._8_4_ = auVar175._8_4_ * auVar112._8_4_;
            auVar68._12_4_ = auVar175._12_4_ * auVar112._12_4_;
            auVar68._16_4_ = auVar175._16_4_ * auVar112._16_4_;
            auVar68._20_4_ = auVar175._20_4_ * auVar112._20_4_;
            auVar68._24_4_ = auVar175._24_4_ * auVar112._24_4_;
            auVar68._28_4_ = auVar109._28_4_;
            auVar159 = vfmsub231ps_fma(auVar68,auVar110,auVar138);
            auVar187._0_4_ = auVar138._0_4_ * auVar219._0_4_;
            auVar187._4_4_ = auVar138._4_4_ * auVar219._4_4_;
            auVar187._8_4_ = auVar138._8_4_ * auVar219._8_4_;
            auVar187._12_4_ = auVar138._12_4_ * auVar219._12_4_;
            auVar187._16_4_ = auVar138._16_4_ * auVar219._16_4_;
            auVar187._20_4_ = auVar138._20_4_ * auVar219._20_4_;
            auVar187._24_4_ = auVar138._24_4_ * auVar219._24_4_;
            auVar187._28_4_ = 0;
            auVar128 = vfmsub231ps_fma(auVar187,auVar204,auVar112);
            auVar69._4_4_ = auVar204._4_4_ * auVar110._4_4_;
            auVar69._0_4_ = auVar204._0_4_ * auVar110._0_4_;
            auVar69._8_4_ = auVar204._8_4_ * auVar110._8_4_;
            auVar69._12_4_ = auVar204._12_4_ * auVar110._12_4_;
            auVar69._16_4_ = auVar204._16_4_ * auVar110._16_4_;
            auVar69._20_4_ = auVar204._20_4_ * auVar110._20_4_;
            auVar69._24_4_ = auVar204._24_4_ * auVar110._24_4_;
            auVar69._28_4_ = auVar110._28_4_;
            auVar167 = vfmsub231ps_fma(auVar69,auVar219,auVar175);
            auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar128),ZEXT1632(auVar167));
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar159),auVar117);
            auVar109 = vrcpps_avx(ZEXT1632(auVar101));
            auVar226._8_4_ = 0x3f800000;
            auVar226._0_8_ = 0x3f8000003f800000;
            auVar226._12_4_ = 0x3f800000;
            auVar226._16_4_ = 0x3f800000;
            auVar226._20_4_ = 0x3f800000;
            auVar226._24_4_ = 0x3f800000;
            auVar226._28_4_ = 0x3f800000;
            auVar227 = ZEXT3264(auVar226);
            auVar16 = vfnmadd213ps_fma(auVar109,ZEXT1632(auVar101),auVar226);
            auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar109,auVar109);
            auVar70._4_4_ = auVar167._4_4_ * local_780._4_4_;
            auVar70._0_4_ = auVar167._0_4_ * local_780._0_4_;
            auVar70._8_4_ = auVar167._8_4_ * local_780._8_4_;
            auVar70._12_4_ = auVar167._12_4_ * local_780._12_4_;
            auVar70._16_4_ = local_780._16_4_ * 0.0;
            auVar70._20_4_ = local_780._20_4_ * 0.0;
            auVar70._24_4_ = local_780._24_4_ * 0.0;
            auVar70._28_4_ = auVar220._28_4_;
            auVar128 = vfmadd231ps_fma(auVar70,ZEXT1632(auVar128),auVar220);
            auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),ZEXT1632(auVar159),auVar108);
            fVar125 = auVar16._0_4_;
            fVar195 = auVar16._4_4_;
            fVar196 = auVar16._8_4_;
            fVar197 = auVar16._12_4_;
            auVar109 = ZEXT1632(CONCAT412(fVar197 * auVar128._12_4_,
                                          CONCAT48(fVar196 * auVar128._8_4_,
                                                   CONCAT44(fVar195 * auVar128._4_4_,
                                                            fVar125 * auVar128._0_4_))));
            uVar222 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar164._4_4_ = uVar222;
            auVar164._0_4_ = uVar222;
            auVar164._8_4_ = uVar222;
            auVar164._12_4_ = uVar222;
            auVar164._16_4_ = uVar222;
            auVar164._20_4_ = uVar222;
            auVar164._24_4_ = uVar222;
            auVar164._28_4_ = uVar222;
            auVar86._4_4_ = uStack_fc;
            auVar86._0_4_ = local_100;
            auVar86._8_4_ = uStack_f8;
            auVar86._12_4_ = uStack_f4;
            auVar86._16_4_ = uStack_f0;
            auVar86._20_4_ = uStack_ec;
            auVar86._24_4_ = uStack_e8;
            auVar86._28_4_ = uStack_e4;
            auVar108 = vcmpps_avx(auVar86,auVar109,2);
            auVar220 = vcmpps_avx(auVar109,auVar164,2);
            auVar108 = vandps_avx(auVar220,auVar108);
            auVar16 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar15 = vpand_avx(auVar15,auVar16);
            auVar108 = vpmovsxwd_avx2(auVar15);
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar108 >> 0x7f,0) == '\0') &&
                  (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0xbf,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar108[0x1f]) goto LAB_0117df04;
            auVar108 = vcmpps_avx(ZEXT1632(auVar101),ZEXT832(0) << 0x20,4);
            auVar16 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar15 = vpand_avx(auVar15,auVar16);
            auVar108 = vpmovsxwd_avx2(auVar15);
            auVar165._8_8_ = uStack_658;
            auVar165._0_8_ = local_660;
            auVar165._16_8_ = uStack_650;
            auVar165._24_8_ = uStack_648;
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar108 >> 0x7f,0) != '\0') ||
                  (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0xbf,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar108[0x1f] < '\0') {
              auVar117 = ZEXT1632(CONCAT412(fVar197 * auVar105._12_4_,
                                            CONCAT48(fVar196 * auVar105._8_4_,
                                                     CONCAT44(fVar195 * auVar105._4_4_,
                                                              fVar125 * auVar105._0_4_))));
              auVar71._28_4_ = SUB84(uStack_648,4);
              auVar71._0_28_ =
                   ZEXT1628(CONCAT412(fVar197 * auVar149._12_4_,
                                      CONCAT48(fVar196 * auVar149._8_4_,
                                               CONCAT44(fVar195 * auVar149._4_4_,
                                                        fVar125 * auVar149._0_4_))));
              auVar194._8_4_ = 0x3f800000;
              auVar194._0_8_ = 0x3f8000003f800000;
              auVar194._12_4_ = 0x3f800000;
              auVar194._16_4_ = 0x3f800000;
              auVar194._20_4_ = 0x3f800000;
              auVar194._24_4_ = 0x3f800000;
              auVar194._28_4_ = 0x3f800000;
              auVar220 = vsubps_avx(auVar194,auVar117);
              local_7e0 = vblendvps_avx(auVar220,auVar117,auVar20);
              auVar220 = vsubps_avx(auVar194,auVar71);
              local_4e0 = vblendvps_avx(auVar220,auVar71,auVar20);
              auVar165 = auVar108;
              local_600 = auVar109;
            }
          }
          auVar221 = ZEXT3264(local_620);
          auVar85._4_4_ = fStack_4fc;
          auVar85._0_4_ = local_500;
          auVar85._8_4_ = fStack_4f8;
          auVar85._12_4_ = fStack_4f4;
          auVar85._16_4_ = fStack_4f0;
          auVar85._20_4_ = fStack_4ec;
          auVar85._24_4_ = fStack_4e8;
          auVar85._28_4_ = fStack_4e4;
          auVar205 = ZEXT3264(auVar85);
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar165[0x1f] < '\0') {
            auVar108 = vsubps_avx(auVar230,_local_520);
            auVar15 = vfmadd213ps_fma(auVar108,local_7e0,_local_520);
            fVar125 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar72._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar125;
            auVar72._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar125;
            auVar72._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar125;
            auVar72._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar125;
            auVar72._16_4_ = fVar125 * 0.0;
            auVar72._20_4_ = fVar125 * 0.0;
            auVar72._24_4_ = fVar125 * 0.0;
            auVar72._28_4_ = fVar125;
            auVar108 = vcmpps_avx(local_600,auVar72,6);
            auVar220 = auVar165 & auVar108;
            if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar220 >> 0x7f,0) != '\0') ||
                  (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar220 >> 0xbf,0) != '\0') ||
                (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar220[0x1f] < '\0') {
              auVar140._8_4_ = 0xbf800000;
              auVar140._0_8_ = 0xbf800000bf800000;
              auVar140._12_4_ = 0xbf800000;
              auVar140._16_4_ = 0xbf800000;
              auVar140._20_4_ = 0xbf800000;
              auVar140._24_4_ = 0xbf800000;
              auVar140._28_4_ = 0xbf800000;
              auVar158._8_4_ = 0x40000000;
              auVar158._0_8_ = 0x4000000040000000;
              auVar158._12_4_ = 0x40000000;
              auVar158._16_4_ = 0x40000000;
              auVar158._20_4_ = 0x40000000;
              auVar158._24_4_ = 0x40000000;
              auVar158._28_4_ = 0x40000000;
              auVar15 = vfmadd213ps_fma(local_4e0,auVar158,auVar140);
              local_3c0 = local_7e0;
              local_3a0 = ZEXT1632(auVar15);
              local_380 = local_600;
              pGVar13 = (context->scene->geometries).items[uVar91].ptr;
              auVar146 = ZEXT3264(local_7e0);
              local_4e0 = local_3a0;
              if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_0117dbf6;
              local_6c0 = vandps_avx(auVar108,auVar165);
              fVar148 = (float)local_360;
              local_2e0[0] = (fVar148 + local_7e0._0_4_ + 0.0) * local_120;
              local_2e0[1] = (fVar148 + local_7e0._4_4_ + 1.0) * fStack_11c;
              local_2e0[2] = (fVar148 + local_7e0._8_4_ + 2.0) * fStack_118;
              local_2e0[3] = (fVar148 + local_7e0._12_4_ + 3.0) * fStack_114;
              fStack_2d0 = (fVar148 + local_7e0._16_4_ + 4.0) * fStack_110;
              fStack_2cc = (fVar148 + local_7e0._20_4_ + 5.0) * fStack_10c;
              fStack_2c8 = (fVar148 + local_7e0._24_4_ + 6.0) * fStack_108;
              fStack_2c4 = fVar148 + local_7e0._28_4_ + 7.0;
              local_4e0._0_8_ = auVar15._0_8_;
              local_4e0._8_8_ = auVar15._8_8_;
              local_2c0 = local_4e0._0_8_;
              uStack_2b8 = local_4e0._8_8_;
              uStack_2b0 = 0;
              uStack_2a8 = 0;
              local_2a0 = local_600;
              auVar141._8_4_ = 0x7f800000;
              auVar141._0_8_ = 0x7f8000007f800000;
              auVar141._12_4_ = 0x7f800000;
              auVar141._16_4_ = 0x7f800000;
              auVar141._20_4_ = 0x7f800000;
              auVar141._24_4_ = 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar108 = vblendvps_avx(auVar141,local_600,local_6c0);
              auVar220 = vshufps_avx(auVar108,auVar108,0xb1);
              auVar220 = vminps_avx(auVar108,auVar220);
              auVar109 = vshufpd_avx(auVar220,auVar220,5);
              auVar220 = vminps_avx(auVar220,auVar109);
              auVar109 = vpermpd_avx2(auVar220,0x4e);
              auVar220 = vminps_avx(auVar220,auVar109);
              auVar220 = vcmpps_avx(auVar108,auVar220,0);
              auVar109 = local_6c0 & auVar220;
              auVar108 = local_6c0;
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar109 >> 0x7f,0) != '\0') ||
                    (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0xbf,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar109[0x1f] < '\0') {
                auVar108 = vandps_avx(auVar220,local_6c0);
              }
              uVar92 = vmovmskps_avx(auVar108);
              uVar8 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                uVar8 = uVar8 + 1;
              }
              uVar93 = (ulong)uVar8;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar148 = local_2e0[uVar93];
                fVar147 = 1.0 - fVar148;
                auVar105 = ZEXT416((uint)fVar148);
                auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                          ZEXT416(0xc0a00000));
                auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * 3.0)),
                                          ZEXT416((uint)(fVar148 + fVar148)),auVar15);
                auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                          ZEXT416(0x40000000));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                          ZEXT416((uint)(fVar147 + fVar147)),auVar15);
                auVar149 = vfnmadd231ss_fma(ZEXT416((uint)(fVar148 * (fVar147 + fVar147))),
                                            ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),auVar105,
                                           ZEXT416((uint)(fVar147 * -2.0)));
                fVar147 = auVar15._0_4_ * 0.5;
                fVar120 = auVar105._0_4_ * 0.5;
                auVar162._0_4_ = fVar120 * local_920;
                auVar162._4_4_ = fVar120 * fStack_91c;
                auVar162._8_4_ = fVar120 * fStack_918;
                auVar162._12_4_ = fVar120 * fStack_914;
                auVar130._4_4_ = fVar147;
                auVar130._0_4_ = fVar147;
                auVar130._8_4_ = fVar147;
                auVar130._12_4_ = fVar147;
                auVar15 = vfmadd132ps_fma(auVar130,auVar162,auVar17);
                fVar147 = auVar16._0_4_ * 0.5;
                auVar163._4_4_ = fVar147;
                auVar163._0_4_ = fVar147;
                auVar163._8_4_ = fVar147;
                auVar163._12_4_ = fVar147;
                auVar15 = vfmadd132ps_fma(auVar163,auVar15,auVar18);
                uVar96 = *(undefined4 *)((long)&local_2c0 + uVar93 * 4);
                fVar147 = auVar149._0_4_ * 0.5;
                auVar151._4_4_ = fVar147;
                auVar151._0_4_ = fVar147;
                auVar151._8_4_ = fVar147;
                auVar151._12_4_ = fVar147;
                auVar15 = vfmadd132ps_fma(auVar151,auVar15,auVar19);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar93 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar15._0_4_;
                uVar222 = vextractps_avx(auVar15,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar222;
                uVar222 = vextractps_avx(auVar15,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar222;
                *(float *)(ray + k * 4 + 0x1e0) = fVar148;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar96;
                *(uint *)(ray + k * 4 + 0x220) = uVar12;
                *(uint *)(ray + k * 4 + 0x240) = uVar91;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar108 = vpcmpeqd_avx2(auVar85,auVar85);
                auVar166 = ZEXT3264(auVar108);
                local_800 = ray;
                _local_5c0 = *pauVar5;
                local_35c = iVar90;
                local_350 = uVar75;
                uStack_348 = uVar76;
                local_340 = uVar77;
                uStack_338 = uVar78;
                local_330 = uVar79;
                uStack_328 = uVar80;
                local_320 = uVar81;
                uStack_318 = uVar82;
                while( true ) {
                  fVar148 = local_2e0[uVar93];
                  auVar106._4_4_ = fVar148;
                  auVar106._0_4_ = fVar148;
                  auVar106._8_4_ = fVar148;
                  auVar106._12_4_ = fVar148;
                  local_1e0._16_4_ = fVar148;
                  local_1e0._0_16_ = auVar106;
                  local_1e0._20_4_ = fVar148;
                  local_1e0._24_4_ = fVar148;
                  local_1e0._28_4_ = fVar148;
                  local_1c0 = *(undefined4 *)((long)&local_2c0 + uVar93 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar93 * 4);
                  fVar147 = 1.0 - fVar148;
                  auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,
                                            ZEXT416(0xc0a00000));
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * 3.0)),
                                            ZEXT416((uint)(fVar148 + fVar148)),auVar15);
                  auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,
                                            ZEXT416(0x40000000));
                  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                            ZEXT416((uint)(fVar147 + fVar147)),auVar15);
                  auVar149 = vfnmadd231ss_fma(ZEXT416((uint)(fVar148 * (fVar147 + fVar147))),
                                              ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),auVar106,
                                             ZEXT416((uint)(fVar147 * -2.0)));
                  fVar148 = auVar15._0_4_ * 0.5;
                  fVar147 = auVar105._0_4_ * 0.5;
                  auVar169._0_4_ = fVar147 * local_920;
                  auVar169._4_4_ = fVar147 * fStack_91c;
                  auVar169._8_4_ = fVar147 * fStack_918;
                  auVar169._12_4_ = fVar147 * fStack_914;
                  auVar152._4_4_ = fVar148;
                  auVar152._0_4_ = fVar148;
                  auVar152._8_4_ = fVar148;
                  auVar152._12_4_ = fVar148;
                  auVar15 = vfmadd132ps_fma(auVar152,auVar169,auVar103);
                  fVar148 = auVar16._0_4_ * 0.5;
                  auVar170._4_4_ = fVar148;
                  auVar170._0_4_ = fVar148;
                  auVar170._8_4_ = fVar148;
                  auVar170._12_4_ = fVar148;
                  auVar15 = vfmadd132ps_fma(auVar170,auVar15,auVar102);
                  local_830.context = context->user;
                  fVar148 = auVar149._0_4_ * 0.5;
                  auVar153._4_4_ = fVar148;
                  auVar153._0_4_ = fVar148;
                  auVar153._8_4_ = fVar148;
                  auVar153._12_4_ = fVar148;
                  auVar16 = vfmadd132ps_fma(auVar153,auVar15,auVar127);
                  local_240 = auVar16._0_4_;
                  uStack_23c = local_240;
                  uStack_238 = local_240;
                  uStack_234 = local_240;
                  uStack_230 = local_240;
                  uStack_22c = local_240;
                  uStack_228 = local_240;
                  uStack_224 = local_240;
                  auVar15 = vmovshdup_avx(auVar16);
                  local_220 = auVar15._0_8_;
                  uStack_218 = local_220;
                  uStack_210 = local_220;
                  uStack_208 = local_220;
                  auVar15 = vshufps_avx(auVar16,auVar16,0xaa);
                  local_200 = auVar15._0_8_;
                  uStack_1f8 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1e8 = local_200;
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = local_560._0_8_;
                  uStack_198 = local_560._8_8_;
                  uStack_190 = CONCAT44(uStack_54c,uStack_550);
                  uStack_188 = CONCAT44(uStack_544,uStack_548);
                  local_180 = local_540;
                  uStack_178 = uStack_538;
                  uStack_170 = CONCAT44(uStack_52c,uStack_530);
                  uStack_168 = CONCAT44(uStack_524,uStack_528);
                  local_7e8[1] = auVar166._0_32_;
                  *local_7e8 = auVar166._0_32_;
                  local_160 = (local_830.context)->instID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_140 = (local_830.context)->instPrimID[0];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  local_6a0 = local_280;
                  local_830.valid = (int *)local_6a0;
                  local_830.geometryUserPtr = pGVar13->userPtr;
                  local_830.hit = (RTCHitN *)&local_240;
                  local_830.N = 8;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar108 = ZEXT1632(auVar166._0_16_);
                    auVar227 = ZEXT1664(auVar227._0_16_);
                    auVar231 = ZEXT1664(auVar231._0_16_);
                    (*pGVar13->intersectionFilterN)(&local_830);
                    auVar108 = vpcmpeqd_avx2(auVar108,auVar108);
                    auVar166 = ZEXT3264(auVar108);
                    auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                    ray = local_800;
                  }
                  auVar220 = vpcmpeqd_avx2(local_6a0,auVar146._0_32_);
                  auVar108 = auVar166._0_32_ & ~auVar220;
                  if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar108 >> 0x7f,0) == '\0') &&
                        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar108 >> 0xbf,0) == '\0') &&
                      (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar108[0x1f]) {
                    auVar220 = auVar166._0_32_ ^ auVar220;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar108 = ZEXT1632(auVar166._0_16_);
                      auVar227 = ZEXT1664(auVar227._0_16_);
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      (*p_Var14)(&local_830);
                      auVar108 = vpcmpeqd_avx2(auVar108,auVar108);
                      auVar166 = ZEXT3264(auVar108);
                      auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                      ray = local_800;
                    }
                    auVar109 = vpcmpeqd_avx2(local_6a0,auVar146._0_32_);
                    auVar220 = auVar166._0_32_ ^ auVar109;
                    auVar108 = auVar166._0_32_ & ~auVar109;
                    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar108 >> 0x7f,0) != '\0') ||
                          (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar108 >> 0xbf,0) != '\0') ||
                        (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar108[0x1f] < '\0') {
                      auVar142._0_4_ = auVar166._0_4_ ^ auVar109._0_4_;
                      auVar142._4_4_ = auVar166._4_4_ ^ auVar109._4_4_;
                      auVar142._8_4_ = auVar166._8_4_ ^ auVar109._8_4_;
                      auVar142._12_4_ = auVar166._12_4_ ^ auVar109._12_4_;
                      auVar142._16_4_ = auVar166._16_4_ ^ auVar109._16_4_;
                      auVar142._20_4_ = auVar166._20_4_ ^ auVar109._20_4_;
                      auVar142._24_4_ = auVar166._24_4_ ^ auVar109._24_4_;
                      auVar142._28_4_ = auVar166._28_4_ ^ auVar109._28_4_;
                      auVar108 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])local_830.hit);
                      *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar108;
                      auVar108 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x20));
                      *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar108;
                      auVar108 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x40));
                      *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar108;
                      auVar108 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x60));
                      *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar108;
                      auVar108 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x80));
                      *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar108;
                      auVar108 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xa0));
                      *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar108;
                      auVar108 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xc0));
                      *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar108;
                      auVar108 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xe0));
                      *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar108;
                      auVar108 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                           (local_830.hit + 0x100));
                      *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar108;
                    }
                  }
                  auVar108 = local_600;
                  if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar220 >> 0x7f,0) == '\0') &&
                        (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar220 >> 0xbf,0) == '\0') &&
                      (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar220[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar96;
                  }
                  else {
                    uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_6c0 + uVar93 * 4) = 0;
                  auVar118._4_4_ = uVar96;
                  auVar118._0_4_ = uVar96;
                  auVar118._8_4_ = uVar96;
                  auVar118._12_4_ = uVar96;
                  auVar118._16_4_ = uVar96;
                  auVar118._20_4_ = uVar96;
                  auVar118._24_4_ = uVar96;
                  auVar118._28_4_ = uVar96;
                  auVar109 = vcmpps_avx(auVar108,auVar118,2);
                  auVar220 = vandps_avx(auVar109,local_6c0);
                  local_6c0 = local_6c0 & auVar109;
                  if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                        (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                      (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6c0[0x1f]) break;
                  auVar143._8_4_ = 0x7f800000;
                  auVar143._0_8_ = 0x7f8000007f800000;
                  auVar143._12_4_ = 0x7f800000;
                  auVar143._16_4_ = 0x7f800000;
                  auVar143._20_4_ = 0x7f800000;
                  auVar143._24_4_ = 0x7f800000;
                  auVar143._28_4_ = 0x7f800000;
                  auVar108 = vblendvps_avx(auVar143,auVar108,auVar220);
                  auVar109 = vshufps_avx(auVar108,auVar108,0xb1);
                  auVar109 = vminps_avx(auVar108,auVar109);
                  auVar117 = vshufpd_avx(auVar109,auVar109,5);
                  auVar109 = vminps_avx(auVar109,auVar117);
                  auVar117 = vpermpd_avx2(auVar109,0x4e);
                  auVar109 = vminps_avx(auVar109,auVar117);
                  auVar109 = vcmpps_avx(auVar108,auVar109,0);
                  auVar117 = auVar220 & auVar109;
                  auVar108 = auVar220;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0x7f,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar117 >> 0xbf,0) != '\0') ||
                      (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar117[0x1f] < '\0') {
                    auVar108 = vandps_avx(auVar109,auVar220);
                  }
                  uVar92 = vmovmskps_avx(auVar108);
                  uVar8 = 0;
                  for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                    uVar8 = uVar8 + 1;
                  }
                  uVar93 = (ulong)uVar8;
                  local_6c0 = auVar220;
                }
                auVar221 = ZEXT3264(local_620);
                auVar205 = ZEXT3264(CONCAT428(fStack_4e4,
                                              CONCAT424(fStack_4e8,
                                                        CONCAT420(fStack_4ec,
                                                                  CONCAT416(fStack_4f0,
                                                                            CONCAT412(fStack_4f4,
                                                                                      CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
              }
            }
          }
          auVar146 = ZEXT3264(local_7e0);
          fVar148 = (float)local_760;
          fVar147 = local_760._4_4_;
          fVar120 = (float)uStack_758;
          fVar121 = uStack_758._4_4_;
          fVar122 = (float)uStack_750;
          fVar123 = uStack_750._4_4_;
          fVar124 = (float)uStack_748;
          uVar96 = uStack_748._4_4_;
        }
LAB_0117dbf6:
        auVar166 = ZEXT3264(local_6e0);
      }
    }
    uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar104._4_4_ = uVar96;
    auVar104._0_4_ = uVar96;
    auVar104._8_4_ = uVar96;
    auVar104._12_4_ = uVar96;
    auVar15 = vcmpps_avx(local_3e0,auVar104,2);
    uVar91 = vmovmskps_avx(auVar15);
    uVar97 = (ulong)((uint)uVar97 & uVar91);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }